

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  ImBitVector *this;
  uint *puVar1;
  stbtt__edge *psVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  stbtt__point sVar6;
  stbtt__point sVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  stbtt_uint8 sVar11;
  byte bVar12;
  ImWchar IVar13;
  uint uVar14;
  ImFont *pIVar15;
  ImFont **ppIVar16;
  stbtt_uint8 *data;
  undefined8 *puVar17;
  ImFontConfig *pIVar18;
  long lVar19;
  char cVar20;
  char cVar26;
  short sVar34;
  stbrp_node *psVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [14];
  unkuint10 Var38;
  undefined1 auVar39 [12];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  unkbyte10 Var43;
  stbtt__point *psVar44;
  undefined1 auVar45 [13];
  undefined1 auVar46 [11];
  undefined1 auVar47 [14];
  undefined1 auVar48 [15];
  undefined1 auVar49 [14];
  undefined1 auVar50 [16];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  uint6 uVar56;
  size_t sVar57;
  bool bVar58;
  ushort uVar59;
  short sVar60;
  stbtt_uint32 sVar61;
  uint uVar68;
  int iVar69;
  uint uVar70;
  stbtt__active_edge *z;
  stbtt_uint32 sVar62;
  stbtt_uint32 sVar63;
  stbtt_uint32 sVar64;
  stbtt_uint32 sVar65;
  stbtt_uint32 sVar66;
  stbtt_uint32 sVar67;
  ulong uVar71;
  undefined4 extraout_var;
  int *piVar72;
  void *pvVar73;
  void *pvVar74;
  stbrp_context *ptr;
  uchar *puVar75;
  stbtt__point *points;
  stbtt__edge *p_00;
  stbtt__buf *scanline;
  stbtt__buf *psVar76;
  stbtt__active_edge *psVar77;
  undefined8 *puVar78;
  int iVar79;
  long lVar80;
  ulong uVar81;
  ImWchar *pIVar82;
  uint *puVar83;
  stbtt__active_edge *psVar84;
  stbtt__active_edge *psVar85;
  char *__function;
  long lVar86;
  ulong uVar87;
  size_t sVar88;
  byte *pbVar89;
  ushort *puVar90;
  uchar uVar91;
  int iVar92;
  ulong uVar93;
  size_t size;
  byte *pbVar94;
  long lVar95;
  ImFontConfig *pIVar96;
  int iVar97;
  float fVar98;
  int iVar99;
  stbtt__active_edge *psVar100;
  ImFontAtlas *pIVar101;
  ImU32 bit_n;
  uint uVar102;
  int iVar103;
  stbtt_fontinfo *psVar104;
  long lVar105;
  void *p;
  long lVar106;
  bool bVar107;
  byte bVar108;
  float fVar109;
  byte bVar119;
  char cVar120;
  short sVar122;
  ushort uVar123;
  short sVar124;
  undefined1 auVar110 [16];
  char cVar121;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  uint uVar133;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  uint uVar134;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  uint uVar135;
  uint uVar139;
  uint uVar140;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  uint uVar141;
  undefined1 auVar138 [16];
  uint uVar142;
  uint uVar143;
  uint uVar144;
  undefined1 in_XMM3 [16];
  uint uVar145;
  undefined4 uVar146;
  undefined4 uVar147;
  undefined4 uVar148;
  uint uVar149;
  float fVar153;
  float fVar154;
  undefined1 auVar150 [16];
  float fVar155;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar156;
  float fVar161;
  float fVar162;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar163;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar164;
  undefined6 uVar165;
  float fVar172;
  uint uVar173;
  undefined1 auVar169 [16];
  float fVar174;
  float fVar175;
  undefined1 auVar170 [16];
  float fVar176;
  float fVar182;
  float fVar183;
  undefined1 auVar177 [16];
  float fVar184;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined6 uVar185;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  stbtt__buf sVar200;
  float y0_2;
  int y1;
  stbtt_uint32 charstrings;
  ImVector<stbrp_rect> buf_rects;
  ImVector<stbtt_packedchar> buf_packedchars;
  stbtt_uint32 fdarrayoff;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  stbtt__buf b;
  undefined8 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb1c;
  int iVar201;
  void *local_4d0;
  stbtt__buf in_stack_fffffffffffffb38;
  undefined1 auVar202 [12];
  stbtt_uint32 local_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  float local_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined1 local_468 [16];
  ImFontAtlas *local_458;
  void *local_450;
  undefined1 local_448 [16];
  ulong local_430;
  int local_424;
  void *local_420;
  undefined8 local_418;
  void *pvStack_410;
  stbrp_node *local_408;
  ulong local_400;
  undefined8 local_3f8;
  float local_3ec;
  undefined1 local_3e8 [16];
  undefined8 *local_3d0;
  stbtt__edge *local_3c8;
  ulong local_3c0;
  int local_3b8;
  float local_3b4;
  long local_3b0;
  ulong local_3a8;
  uchar *local_3a0;
  long local_398;
  uchar *local_390;
  ulong local_388;
  ulong local_380;
  float *local_378;
  size_t local_370;
  uint local_364;
  uint local_360;
  int local_35c;
  float local_358;
  int local_354;
  int local_350;
  int local_34c;
  undefined1 local_348 [16];
  stbrp_context *local_338;
  stbtt_fontinfo *local_330;
  stbtt__point *local_328;
  float *local_320;
  ulong local_318;
  ulong local_310;
  size_t local_308;
  ImFontConfig *local_300;
  long local_2f8;
  undefined4 *local_2f0;
  long local_2e8;
  long local_2e0;
  size_t local_2d8;
  size_t local_2d0;
  stbtt__active_edge *local_2c8;
  int local_2c0;
  int local_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  ulong local_298;
  undefined8 uStack_290;
  stbtt__buf local_288 [33];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  undefined1 auVar111 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined8 uVar166;
  undefined1 auVar167 [12];
  undefined1 auVar168 [14];
  undefined1 auVar171 [16];
  undefined8 uVar186;
  undefined1 auVar187 [12];
  undefined1 auVar188 [14];
  undefined1 auVar193 [16];
  
  local_3e8._8_8_ = local_3e8._0_8_;
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x79d,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  local_4d0 = (void *)0x0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  uVar14 = (atlas->ConfigData).Size;
  lVar80 = (long)(int)uVar14;
  if (0 < lVar80) {
    uVar71 = 8;
    if (8 < (int)uVar14) {
      uVar71 = (ulong)uVar14;
    }
    local_4d0 = ImGui::MemAlloc(uVar71 * 0x110);
  }
  uVar68 = (atlas->Fonts).Size;
  lVar106 = (long)(int)uVar68;
  if (lVar106 < 1) {
    local_420 = (void *)0x0;
  }
  else {
    uVar71 = 8;
    if (8 < (int)uVar68) {
      uVar71 = (ulong)uVar68;
    }
    local_420 = ImGui::MemAlloc(uVar71 << 5);
  }
  local_308 = lVar80 * 0x110;
  memset(local_4d0,0,local_308);
  local_370 = lVar106 << 5;
  memset(local_420,0,local_370);
  uVar81 = in_stack_fffffffffffffb38._8_8_;
  uVar68 = (atlas->ConfigData).Size;
  uVar71 = (ulong)uVar68;
  iVar201 = CONCAT13((int)uVar68 < 1,(int3)in_stack_fffffffffffffb1c);
  local_3e8._0_8_ = lVar106;
  local_458 = atlas;
  if (0 < (int)uVar68) {
    uVar81 = 0;
    if (0 < (int)uVar14) {
      uVar81 = (ulong)uVar14;
    }
    local_348._0_8_ = uVar81;
    lVar95 = 0;
    do {
      auVar202 = in_stack_fffffffffffffb38._4_12_;
      if (lVar95 == local_348._0_8_) {
        __function = "T &ImVector<ImFontBuildSrcData>::operator[](int) [T = ImFontBuildSrcData]";
        goto LAB_00164c58;
      }
      if ((int)uVar71 <= lVar95) goto LAB_00164cbf;
      pIVar96 = (atlas->ConfigData).Data;
      pIVar15 = pIVar96[lVar95].DstFont;
      if ((pIVar15 == (ImFont *)0x0) ||
         (pIVar15->ContainerAtlas != atlas && pIVar15->ContainerAtlas != (ImFontAtlas *)0x0)) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                      ,0x7b5,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(undefined4 *)((long)local_4d0 + lVar95 * 0x110 + 0xe0) = 0xffffffff;
      uVar71 = (ulong)(atlas->Fonts).Size;
      if ((long)uVar71 < 1) {
LAB_00164d0f:
        __assert_fail("src_tmp.DstIndex != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                      ,0x7bc,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      pIVar96 = pIVar96 + lVar95;
      ppIVar16 = (atlas->Fonts).Data;
      uVar93 = 0xffffffff;
      uVar81 = 0;
      do {
        if (pIVar15 == ppIVar16[uVar81]) {
          *(int *)((long)local_4d0 + lVar95 * 0x110 + 0xe0) = (int)uVar81;
          uVar93 = uVar81 & 0xffffffff;
        }
        uVar81 = uVar81 + 1;
      } while ((uVar81 < uVar71) && ((int)uVar93 == -1));
      if ((int)uVar93 == -1) goto LAB_00164d0f;
      data = (stbtt_uint8 *)pIVar96->FontData;
      iVar103 = pIVar96->FontNo;
      sVar11 = *data;
      if (((((sVar11 == '1') && (data[1] == '\0')) && (data[2] == '\0')) && (data[3] == '\0')) ||
         (((sVar11 == 't' && (data[1] == 'y')) && ((data[2] == 'p' && (data[3] == '1')))))) {
LAB_001617aa:
        sVar67 = -(uint)(iVar103 != 0);
      }
      else {
        if (sVar11 == '\0') {
          if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_00161783;
          goto LAB_001617aa;
        }
        if ((((sVar11 == 'O') && (data[1] == 'T')) && (data[2] == 'T')) && (data[3] == 'O'))
        goto LAB_001617aa;
LAB_00161783:
        sVar67 = 0xffffffff;
        if (sVar11 == 't') {
          if (data[1] == 't') {
            if ((data[2] == 'c') && (data[3] == 'f')) {
              uVar68 = *(uint *)(data + 4);
              uVar68 = uVar68 >> 0x18 | (uVar68 & 0xff0000) >> 8 | (uVar68 & 0xff00) << 8 |
                       uVar68 << 0x18;
              if (((uVar68 == 0x20000) || (uVar68 == 0x10000)) &&
                 (uVar68 = *(uint *)(data + 8),
                 iVar103 < (int)(uVar68 >> 0x18 | (uVar68 & 0xff0000) >> 8 | (uVar68 & 0xff00) << 8
                                | uVar68 << 0x18))) {
                uVar68 = *(uint *)(data + (long)iVar103 * 4 + 0xc);
                sVar67 = uVar68 >> 0x18 | (uVar68 & 0xff0000) >> 8 | (uVar68 & 0xff00) << 8 |
                         uVar68 << 0x18;
              }
            }
          }
          else if (((data[1] == 'r') && (data[2] == 'u')) && (data[3] == 'e')) goto LAB_001617aa;
        }
      }
      local_488._0_8_ = pIVar96;
      if ((int)sVar67 < 0) {
        __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                      ,0x7c2,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(stbtt_uint8 **)((long)local_4d0 + lVar95 * 0x110 + 8) = data;
      *(stbtt_uint32 *)((long)local_4d0 + lVar95 * 0x110 + 0x10) = sVar67;
      *(undefined8 *)((long)local_4d0 + lVar95 * 0x110 + 0x40) = 0;
      *(undefined8 *)((long)local_4d0 + lVar95 * 0x110 + 0x48) = 0;
      sVar61 = stbtt__find_table(data,sVar67,"cmap");
      auVar125 = local_448;
      local_448._4_4_ = extraout_var;
      local_448._0_4_ = sVar61;
      local_448._8_8_ = auVar125._8_8_;
      sVar61 = stbtt__find_table(data,sVar67,"loca");
      *(stbtt_uint32 *)((long)local_4d0 + lVar95 * 0x110 + 0x18) = sVar61;
      sVar62 = stbtt__find_table(data,sVar67,"head");
      *(stbtt_uint32 *)((long)local_4d0 + lVar95 * 0x110 + 0x1c) = sVar62;
      sVar63 = stbtt__find_table(data,sVar67,"glyf");
      *(stbtt_uint32 *)((long)local_4d0 + lVar95 * 0x110 + 0x20) = sVar63;
      sVar64 = stbtt__find_table(data,sVar67,"hhea");
      *(stbtt_uint32 *)((long)local_4d0 + lVar95 * 0x110 + 0x24) = sVar64;
      sVar65 = stbtt__find_table(data,sVar67,"hmtx");
      *(stbtt_uint32 *)((long)local_4d0 + lVar95 * 0x110 + 0x28) = sVar65;
      sVar66 = stbtt__find_table(data,sVar67,"kern");
      auVar125 = local_448;
      *(stbtt_uint32 *)((long)local_4d0 + lVar95 * 0x110 + 0x2c) = sVar66;
      in_stack_fffffffffffffb38._4_12_ = auVar202;
      in_stack_fffffffffffffb38.data._0_4_ = sVar67;
      uVar166 = local_448._0_8_;
      sVar67 = stbtt__find_table(data,sVar67,"GPOS");
      *(stbtt_uint32 *)((long)local_4d0 + lVar95 * 0x110 + 0x30) = sVar67;
      iVar103 = auVar125._0_4_;
      if ((((iVar103 == 0) || (sVar62 == 0)) || (sVar64 == 0)) || (sVar65 == 0)) goto LAB_00164b31;
      if (sVar63 == 0) {
        local_418 = CONCAT44(local_418._4_4_,2);
        local_498._0_8_ = local_498._0_8_ & 0xffffffff00000000;
        local_3f8._0_4_ = 0;
        local_49c = 0;
        sVar67 = stbtt__find_table(data,(stbtt_uint32)in_stack_fffffffffffffb38.data,"CFF ");
        atlas = local_458;
        if (sVar67 == 0) goto LAB_00164b31;
        *(undefined8 *)((long)local_4d0 + lVar95 * 0x110 + 0x90) = 0;
        *(undefined8 *)((long)local_4d0 + lVar95 * 0x110 + 0x98) = 0;
        *(undefined8 *)((long)local_4d0 + lVar95 * 0x110 + 0x80) = 0;
        *(undefined8 *)((long)local_4d0 + lVar95 * 0x110 + 0x88) = 0;
        *(stbtt_uint8 **)((long)local_4d0 + lVar95 * 0x110 + 0x40) = data + sVar67;
        *(undefined8 *)((long)local_4d0 + lVar95 * 0x110 + 0x48) = 0x2000000000000000;
        local_288[0].data = *(uchar **)((long)local_4d0 + lVar95 * 0x110 + 0x40);
        local_288[0]._8_8_ = *(undefined8 *)((long)local_4d0 + lVar95 * 0x110 + 0x48);
        if ((long)local_288[0].cursor < -2) {
LAB_00164d81:
          __assert_fail("!(o > b->size || o < 0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                        ,0x46c,"void stbtt__buf_seek(stbtt__buf *, int)");
        }
        lVar106 = (long)local_288[0].cursor + 2;
        iVar69 = (int)lVar106;
        if (local_288[0].size < iVar69) goto LAB_00164d81;
        uVar68 = 0;
        if (iVar69 < local_288[0].size) {
          iVar69 = local_288[0].cursor + 3;
          uVar68 = (uint)local_288[0].data[lVar106];
        }
        local_288[0].cursor = iVar69;
        if (local_288[0].size < (int)uVar68) goto LAB_00164d81;
        local_288[0].cursor = uVar68;
        stbtt__cff_get_index(local_288);
        sVar200 = stbtt__cff_get_index(local_288);
        local_468 = (undefined1  [16])stbtt__cff_index_get(sVar200,0);
        stbtt__cff_get_index(local_288);
        sVar200 = stbtt__cff_get_index(local_288);
        *(stbtt__buf *)((long)local_4d0 + lVar95 * 0x110 + 0x60) = sVar200;
        stbtt__dict_get_ints((stbtt__buf *)local_468,0x11,1,(stbtt_uint32 *)local_498);
        stbtt__dict_get_ints((stbtt__buf *)local_468,0x106,1,(stbtt_uint32 *)&local_418);
        stbtt__dict_get_ints((stbtt__buf *)local_468,0x124,1,(stbtt_uint32 *)&local_3f8);
        stbtt__dict_get_ints((stbtt__buf *)local_468,0x125,1,&local_49c);
        sVar200.cursor = sVar61;
        sVar200.data = (uchar *)in_stack_fffffffffffffb10;
        sVar200.size = iVar201;
        sVar200 = stbtt__get_subrs(sVar200,in_stack_fffffffffffffb38);
        sVar67 = local_49c;
        *(stbtt__buf *)((long)local_4d0 + lVar95 * 0x110 + 0x70) = sVar200;
        if (((stbtt_uint32)local_418 != 2) || (uVar146 = local_498._0_4_, local_498._0_4_ == 0))
        goto LAB_00164b31;
        if ((stbtt_uint32)local_3f8 != 0) {
          uVar71 = (ulong)local_49c;
          if (uVar71 == 0) goto LAB_00164b31;
          if (((int)(stbtt_uint32)local_3f8 < 0) ||
             (local_288[0].size < (int)(stbtt_uint32)local_3f8)) goto LAB_00164d81;
          local_288[0].cursor = (stbtt_uint32)local_3f8;
          sVar200 = stbtt__cff_get_index(local_288);
          *(stbtt__buf *)((long)local_4d0 + lVar95 * 0x110 + 0x80) = sVar200;
          puVar75 = local_288[0].data + uVar71;
          lVar106 = (ulong)(local_288[0].size - sVar67) << 0x20;
          if ((int)(local_288[0].size - sVar67 | sVar67) < 0 || local_288[0].size < (int)sVar67) {
            puVar75 = (uchar *)0x0;
            lVar106 = 0;
          }
          *(uchar **)((long)local_4d0 + lVar95 * 0x110 + 0x90) = puVar75;
          *(long *)((long)local_4d0 + lVar95 * 0x110 + 0x98) = lVar106;
        }
        if (((int)uVar146 < 0) || (local_288[0].size < (int)uVar146)) goto LAB_00164d81;
        local_288[0].cursor = uVar146;
        sVar200 = stbtt__cff_get_index(local_288);
        *(stbtt__buf *)((long)local_4d0 + lVar95 * 0x110 + 0x50) = sVar200;
        lVar106 = local_3e8._0_8_;
      }
      else {
        atlas = local_458;
        lVar106 = local_3e8._0_8_;
        if (sVar61 == 0) goto LAB_00164b31;
      }
      sVar67 = stbtt__find_table(data,(stbtt_uint32)in_stack_fffffffffffffb38.data,"maxp");
      uVar81 = in_stack_fffffffffffffb38._8_8_;
      if (sVar67 == 0) {
        uVar68 = 0xffff;
      }
      else {
        uVar68 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar67 + 4) << 8 |
                               *(ushort *)(data + (ulong)sVar67 + 4) >> 8);
      }
      *(uint *)((long)local_4d0 + lVar95 * 0x110 + 0x14) = uVar68;
      uVar59 = *(ushort *)(data + (uVar166 & 0xffffffff) + 2) << 8 |
               *(ushort *)(data + (uVar166 & 0xffffffff) + 2) >> 8;
      *(undefined4 *)((long)local_4d0 + lVar95 * 0x110 + 0x34) = 0;
      if (uVar59 != 0) {
        uVar68 = iVar103 + 4;
        uVar71 = (ulong)uVar59;
        do {
          uVar59 = *(ushort *)(data + uVar68) << 8 | *(ushort *)(data + uVar68) >> 8;
          if ((uVar59 == 0) ||
             ((uVar59 == 3 &&
              ((uVar59 = *(ushort *)(data + (ulong)uVar68 + 2) << 8 |
                         *(ushort *)(data + (ulong)uVar68 + 2) >> 8, uVar59 == 10 || (uVar59 == 1)))
              ))) {
            uVar102 = *(uint *)(data + (ulong)uVar68 + 4);
            *(uint *)((long)local_4d0 + lVar95 * 0x110 + 0x34) =
                 (uVar102 >> 0x18 | (uVar102 & 0xff0000) >> 8 | (uVar102 & 0xff00) << 8 |
                 uVar102 << 0x18) + iVar103;
          }
          uVar68 = uVar68 + 8;
          uVar71 = uVar71 - 1;
        } while (uVar71 != 0);
      }
      if (*(int *)((long)local_4d0 + lVar95 * 0x110 + 0x34) == 0) goto LAB_00164b31;
      *(uint *)((long)local_4d0 + lVar95 * 0x110 + 0x38) =
           (uint)(ushort)(*(ushort *)
                           (data + (long)*(int *)((long)local_4d0 + lVar95 * 0x110 + 0x1c) + 0x32)
                          << 8 | *(ushort *)
                                  (data + (long)*(int *)((long)local_4d0 + lVar95 * 0x110 + 0x1c) +
                                          0x32) >> 8);
      iVar103 = *(int *)((long)local_4d0 + lVar95 * 0x110 + 0xe0);
      if ((int)lVar106 <= iVar103) goto LAB_00164cd6;
      pIVar82 = *(ImWchar **)(local_488._0_8_ + 0x38);
      if (pIVar82 == (ImWchar *)0x0) {
        pIVar82 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)local_4d0 + lVar95 * 0x110 + 0xd8) = pIVar82;
      IVar13 = *pIVar82;
      while (IVar13 != 0) {
        uVar59 = pIVar82[1];
        if (uVar59 == 0) break;
        uVar68 = *(uint *)((long)local_4d0 + lVar95 * 0x110 + 0xe4);
        uVar102 = (uint)uVar59;
        if ((int)(uint)uVar59 < (int)uVar68) {
          uVar102 = uVar68;
        }
        *(uint *)((long)local_4d0 + lVar95 * 0x110 + 0xe4) = uVar102;
        IVar13 = pIVar82[2];
        pIVar82 = pIVar82 + 2;
      }
      piVar72 = (int *)((long)iVar103 * 0x20 + (long)local_420);
      *piVar72 = *piVar72 + 1;
      iVar103 = *(int *)((long)local_4d0 + lVar95 * 0x110 + 0xe4);
      if (iVar103 < piVar72[1]) {
        iVar103 = piVar72[1];
      }
      piVar72[1] = iVar103;
      lVar95 = lVar95 + 1;
      uVar71 = (ulong)(atlas->ConfigData).Size;
      iVar201 = CONCAT13((long)uVar71 <= lVar95,(int3)iVar201);
    } while (lVar95 < (long)uVar71);
  }
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar81;
  auVar136 = auVar125 << 0x40;
  if (0 < (int)uVar14) {
    lVar95 = 0;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = uVar81;
    auVar136 = auVar127 << 0x40;
    do {
      iVar103 = *(int *)((long)local_4d0 + lVar95 * 0x110 + 0xe0);
      if ((int)lVar106 <= iVar103) goto LAB_00164cd6;
      local_448._0_8_ = lVar95;
      psVar104 = (stbtt_fontinfo *)(lVar95 * 0x110 + (long)local_4d0);
      ImBitVector::Create((ImBitVector *)&psVar104[1].charstrings,
                          *(int *)((long)&psVar104[1].cff.data + 4) + 1);
      pvVar74 = local_420;
      this = (ImBitVector *)((long)local_420 + (long)iVar103 * 0x20 + 0x10);
      if (*(int *)((long)local_420 + (long)iVar103 * 0x20 + 0x10) == 0) {
        ImBitVector::Create(this,*(int *)((long)local_420 + (long)iVar103 * 0x20 + 4) + 1);
      }
      puVar90 = *(ushort **)&psVar104[1].indexToLocFormat;
      uVar59 = *puVar90;
      for (; (uVar59 != 0 && (puVar90[1] != 0)); puVar90 = puVar90 + 2) {
        if (uVar59 <= puVar90[1]) {
          auVar125 = auVar136;
          uVar68 = (uint)uVar59;
          do {
            bVar58 = ImBitVector::TestBit(this,uVar68);
            auVar136 = auVar125;
            if ((!bVar58) &&
               (iVar69 = stbtt_FindGlyphIndex(psVar104,uVar68), auVar136 = auVar125, iVar69 != 0)) {
              piVar72 = &psVar104[1].cff.cursor;
              *piVar72 = *piVar72 + 1;
              piVar72 = (int *)((long)pvVar74 + (long)iVar103 * 0x20 + 8);
              *piVar72 = *piVar72 + 1;
              ImBitVector::SetBit((ImBitVector *)&psVar104[1].charstrings,uVar68);
              ImBitVector::SetBit(this,uVar68);
              auVar136._4_4_ = 0;
              auVar136._0_4_ = auVar125._0_4_ + 1;
              auVar136._8_8_ = auVar125._8_8_;
            }
            bVar58 = uVar68 < puVar90[1];
            auVar125 = auVar136;
            uVar68 = uVar68 + 1;
          } while (bVar58);
        }
        uVar59 = puVar90[2];
      }
      lVar95 = local_448._0_8_ + 1;
      lVar106 = local_3e8._0_8_;
    } while (lVar95 != lVar80);
  }
  pIVar101 = local_458;
  if (0 < (int)uVar14) {
    lVar106 = 0;
    do {
      local_488._0_8_ = lVar106;
      lVar106 = lVar106 * 0x110;
      iVar103 = *(int *)((long)local_4d0 + lVar106 + 0xe8);
      if (*(int *)((long)local_4d0 + lVar106 + 0x104) < iVar103) {
        pvVar73 = ImGui::MemAlloc((long)iVar103 << 2);
        pvVar74 = *(void **)((long)local_4d0 + lVar106 + 0x108);
        if (pvVar74 != (void *)0x0) {
          memcpy(pvVar73,pvVar74,(long)*(int *)((long)local_4d0 + lVar106 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)local_4d0 + lVar106 + 0x108));
        }
        *(void **)((long)local_4d0 + lVar106 + 0x108) = pvVar73;
        *(int *)((long)local_4d0 + lVar106 + 0x104) = iVar103;
      }
      lVar95 = (long)*(int *)((long)local_4d0 + lVar106 + 0xf0);
      if (0 < lVar95) {
        puVar83 = *(uint **)((long)local_4d0 + lVar106 + 0xf8);
        puVar1 = puVar83 + lVar95;
        iVar103 = 0;
        do {
          local_448._0_8_ = puVar83;
          uVar68 = *puVar83;
          if (uVar68 != 0) {
            uVar102 = 0;
            do {
              if ((uVar68 >> (uVar102 & 0x1f) & 1) != 0) {
                iVar69 = *(int *)((long)local_4d0 + lVar106 + 0x100);
                iVar92 = *(int *)((long)local_4d0 + lVar106 + 0x104);
                if (iVar69 == iVar92) {
                  if (iVar92 == 0) {
                    iVar79 = 8;
                  }
                  else {
                    iVar79 = iVar92 / 2 + iVar92;
                  }
                  iVar69 = iVar69 + 1;
                  if (iVar69 < iVar79) {
                    iVar69 = iVar79;
                  }
                  if (iVar92 < iVar69) {
                    pvVar73 = ImGui::MemAlloc((long)iVar69 << 2);
                    pvVar74 = *(void **)((long)local_4d0 + lVar106 + 0x108);
                    if (pvVar74 != (void *)0x0) {
                      memcpy(pvVar73,pvVar74,(long)*(int *)((long)local_4d0 + lVar106 + 0x100) << 2)
                      ;
                      ImGui::MemFree(*(void **)((long)local_4d0 + lVar106 + 0x108));
                    }
                    *(void **)((long)local_4d0 + lVar106 + 0x108) = pvVar73;
                    *(int *)((long)local_4d0 + lVar106 + 0x104) = iVar69;
                  }
                }
                *(uint *)(*(long *)((long)local_4d0 + lVar106 + 0x108) +
                         (long)*(int *)((long)local_4d0 + lVar106 + 0x100) * 4) = iVar103 + uVar102;
                piVar72 = (int *)((long)local_4d0 + lVar106 + 0x100);
                *piVar72 = *piVar72 + 1;
                pIVar101 = local_458;
              }
              uVar102 = uVar102 + 1;
            } while (uVar102 != 0x20);
          }
          puVar83 = (uint *)(local_448._0_8_ + 4);
          iVar103 = iVar103 + 0x20;
        } while (puVar83 < puVar1);
      }
      pvVar74 = *(void **)((long)local_4d0 + lVar106 + 0xf8);
      if (pvVar74 != (void *)0x0) {
        *(undefined8 *)((long)local_4d0 + lVar106 + 0xf0) = 0;
        ImGui::MemFree(pvVar74);
        *(undefined8 *)((long)local_4d0 + lVar106 + 0xf8) = 0;
      }
      if (*(int *)((long)local_4d0 + lVar106 + 0x100) != *(int *)((long)local_4d0 + lVar106 + 0xe8))
      {
        __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                      ,0x7f1,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      lVar106 = local_488._0_8_ + 1;
    } while (lVar106 != lVar80);
  }
  sVar57 = local_370;
  pvVar74 = local_420;
  if (0 < (int)local_3e8._0_4_) {
    sVar88 = 0;
    do {
      pvVar73 = *(void **)((long)pvVar74 + sVar88 + 0x18);
      if (pvVar73 != (void *)0x0) {
        *(undefined8 *)((long)pvVar74 + sVar88 + 0x10) = 0;
        ImGui::MemFree(pvVar73);
        *(undefined8 *)((long)pvVar74 + sVar88 + 0x18) = 0;
      }
      sVar88 = sVar88 + 0x20;
    } while (sVar57 != sVar88);
  }
  auVar115 = auVar136;
  if (local_420 != (void *)0x0) {
    ImGui::MemFree(local_420);
    local_420 = (void *)0x0;
  }
  local_468 = ZEXT816(0);
  local_418 = 0;
  pvStack_410 = (void *)0x0;
  uVar68 = auVar136._0_4_;
  if (0 < (int)uVar68) {
    uVar102 = 8;
    if (7 < (int)uVar68) {
      uVar102 = uVar68;
    }
    if (0 < (int)uVar102) {
      pvVar74 = ImGui::MemAlloc((long)(int)uVar102 << 4);
      if ((void *)local_468._8_8_ != (void *)0x0) {
        memcpy(pvVar74,(void *)local_468._8_8_,(long)(int)local_468._0_4_ << 4);
        ImGui::MemFree((void *)local_468._8_8_);
      }
      auVar180._4_8_ = pvVar74;
      auVar180._0_4_ = uVar102;
      auVar180._12_4_ = 0;
      local_468 = auVar180 << 0x20;
    }
  }
  local_468._0_4_ = uVar68;
  if (local_418._4_4_ < (int)uVar68) {
    if (local_418._4_4_ == 0) {
      uVar102 = 8;
    }
    else {
      uVar102 = local_418._4_4_ / 2 + local_418._4_4_;
    }
    if ((int)uVar102 <= (int)uVar68) {
      uVar102 = uVar68;
    }
    if (local_418._4_4_ < (int)uVar102) {
      pvVar74 = ImGui::MemAlloc((long)(int)uVar102 * 0x1c);
      if (pvStack_410 != (void *)0x0) {
        memcpy(pvVar74,pvStack_410,(long)(int)(stbtt_uint32)local_418 * 0x1c);
        ImGui::MemFree(pvStack_410);
      }
      local_418 = (ulong)uVar102 << 0x20;
      pvStack_410 = pvVar74;
    }
  }
  local_418 = CONCAT44(local_418._4_4_,uVar68);
  iVar103 = 0;
  memset((void *)local_468._8_8_,0,(long)(int)local_468._0_4_ << 4);
  memset(pvStack_410,0,(long)(int)(stbtt_uint32)local_418 * 0x1c);
  fVar98 = 0.0;
  if (0 < (int)uVar14) {
    lVar106 = 0;
    iVar69 = 0;
    fVar98 = 0.0;
    do {
      iVar92 = *(int *)((long)local_4d0 + lVar106 * 0x110 + 0xe8);
      if (iVar92 != 0) {
        if ((int)local_468._0_4_ <= iVar69) {
          __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
          goto LAB_00164c58;
        }
        psVar104 = (stbtt_fontinfo *)(lVar106 * 0x110 + (long)local_4d0);
        *(long *)&psVar104[1].hmtx = (long)iVar69 * 0x10 + local_468._8_8_;
        if ((int)(stbtt_uint32)local_418 <= (int)fVar98) {
          __function = "T &ImVector<stbtt_packedchar>::operator[](int) [T = stbtt_packedchar]";
          goto LAB_00164c58;
        }
        pvVar74 = (void *)((long)(int)fVar98 * 0x1c + (long)pvStack_410);
        *(void **)&psVar104[1].gpos = pvVar74;
        if ((pIVar101->ConfigData).Size <= lVar106) goto LAB_00164cbf;
        pIVar96 = (pIVar101->ConfigData).Data;
        fVar109 = pIVar96[lVar106].SizePixels;
        uVar146 = 0;
        uVar147 = 0;
        uVar148 = 0;
        *(float *)&psVar104[1].userdata = fVar109;
        *(undefined4 *)((long)&psVar104[1].userdata + 4) = 0;
        psVar104[1].data = *(uchar **)&psVar104[1].gsubrs.cursor;
        psVar104[1].fontstart = *(int *)&psVar104[1].gsubrs.data;
        *(void **)&psVar104[1].loca = pvVar74;
        *(char *)&psVar104[1].glyf = (char)pIVar96[lVar106].OversampleH;
        *(char *)((long)&psVar104[1].glyf + 1) = (char)pIVar96[lVar106].OversampleV;
        if (fVar109 <= 0.0) {
          uVar146 = 0x80000000;
          uVar147 = 0x80000000;
          uVar148 = 0x80000000;
          fVar109 = -fVar109;
          uVar68 = (uint)(ushort)(*(ushort *)(psVar104->data + (long)psVar104->head + 0x12) << 8 |
                                 *(ushort *)(psVar104->data + (long)psVar104->head + 0x12) >> 8);
        }
        else {
          puVar75 = psVar104->data;
          lVar95 = (long)psVar104->hhea;
          uVar68 = ((int)(short)((ushort)puVar75[lVar95 + 4] << 8) | (uint)puVar75[lVar95 + 5]) -
                   ((int)(short)((ushort)puVar75[lVar95 + 6] << 8) | (uint)puVar75[lVar95 + 7]);
        }
        iVar69 = iVar69 + iVar92;
        fVar98 = (float)((int)fVar98 + iVar92);
        if (0 < *(int *)&psVar104[1].gsubrs.data) {
          auVar115._4_4_ = uVar146;
          auVar115._0_4_ = fVar109 / (float)(int)uVar68;
          auVar115._8_4_ = uVar147;
          auVar115._12_4_ = uVar148;
          local_488._0_4_ = fVar98;
          local_448._0_8_ = lVar106;
          iVar92 = pIVar101->TexGlyphPadding;
          lVar105 = 6;
          lVar95 = 0;
          do {
            if (*(int *)&psVar104[1].gsubrs.data <= lVar95) goto LAB_00164c43;
            iVar79 = stbtt_FindGlyphIndex
                               (psVar104,*(int *)(*(long *)&psVar104[1].gsubrs.cursor + lVar95 * 4))
            ;
            if (iVar79 == 0) {
              __assert_fail("glyph_index_in_font != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                            ,0x820,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
            }
            fVar98 = auVar115._0_4_;
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar104,iVar79,(float)pIVar96[lVar106].OversampleH * fVar98,
                       (float)pIVar96[lVar106].OversampleV * fVar98,fVar98,in_XMM3._0_4_,
                       (int *)local_288,(int *)local_498,(int *)&local_3f8,(int *)&local_49c);
            uVar68 = (pIVar96[lVar106].OversampleH +
                     (((stbtt_uint32)local_3f8 + iVar92) - (int)local_288[0].data)) - 1;
            lVar86 = *(long *)&psVar104[1].hmtx;
            *(short *)(lVar86 + -2 + lVar105) = (short)uVar68;
            uVar102 = (pIVar96[lVar106].OversampleV + ((local_49c + iVar92) - local_498._0_4_)) - 1;
            *(short *)(lVar86 + lVar105) = (short)uVar102;
            iVar103 = iVar103 + (uVar102 & 0xffff) * (uVar68 & 0xffff);
            lVar95 = lVar95 + 1;
            lVar105 = lVar105 + 0x10;
          } while (lVar95 < *(int *)&psVar104[1].gsubrs.data);
          lVar106 = local_448._0_8_;
          pIVar101 = local_458;
          fVar98 = (float)local_488._0_4_;
        }
      }
      lVar106 = lVar106 + 1;
    } while (lVar106 != lVar80);
    fVar98 = (float)iVar103;
  }
  if (fVar98 < 0.0) {
    fVar98 = sqrtf(fVar98);
  }
  else {
    fVar98 = SQRT(fVar98);
  }
  pIVar101->TexHeight = 0;
  local_498._12_4_ = pIVar101->TexDesiredWidth;
  if ((int)local_498._12_4_ < 1) {
    iVar103 = (int)fVar98;
    local_498._12_4_ = 5.73972e-42;
    if ((iVar103 < 0xb33) && (local_498._12_4_ = 2.86986e-42, iVar103 < 0x599)) {
      local_498._12_4_ = (uint)(0x2cb < iVar103) * 0x200 + 0x200;
    }
  }
  pIVar101->TexWidth = local_498._12_4_;
  uVar68 = pIVar101->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar103 = local_498._12_4_ - uVar68;
  local_408 = (stbrp_node *)ImGui::MemAlloc((long)iVar103 << 4);
  if ((ptr == (stbrp_context *)0x0) || (local_408 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_408 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_408);
    }
    local_408 = (stbrp_node *)0x0;
    uVar68 = 0;
    local_498._12_4_ = 0.0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if (((int)uVar68 < -0x7fff) || (0xffff < iVar103)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_rectpack.h"
                    ,0x10a,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    if (iVar103 < 2) {
      uVar71 = 0;
    }
    else {
      uVar71 = 0;
      psVar35 = local_408;
      do {
        uVar71 = uVar71 + 1;
        psVar35->next = psVar35 + 1;
        psVar35 = psVar35 + 1;
      } while (iVar103 - 1 != uVar71);
      uVar71 = uVar71 & 0xffffffff;
    }
    local_408[uVar71].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_408;
    ptr->active_head = ptr->extra;
    ptr->width = iVar103;
    ptr->height = 0x8000 - uVar68;
    ptr->num_nodes = iVar103;
    ptr->align = (iVar103 * 2 + -1) / iVar103;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar103;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  local_338 = ptr;
  ImFontAtlasBuildPackCustomRects(pIVar101,ptr);
  if (0 < (int)uVar14) {
    lVar106 = 0;
    do {
      lVar95 = lVar106 * 0x110;
      iVar103 = *(int *)((long)local_4d0 + lVar95 + 0xe8);
      if (iVar103 != 0) {
        stbrp_pack_rects(local_338,*(stbrp_rect **)((long)local_4d0 + lVar95 + 200),iVar103);
        lVar105 = (long)*(int *)((long)local_4d0 + lVar95 + 0xe8);
        if (0 < lVar105) {
          lVar95 = *(long *)((long)local_4d0 + lVar95 + 200);
          lVar86 = 0;
          do {
            if (*(int *)(lVar95 + 0xc + lVar86) != 0) {
              iVar103 = (uint)*(ushort *)(lVar95 + 6 + lVar86) +
                        (uint)*(ushort *)(lVar95 + 10 + lVar86);
              if (iVar103 < pIVar101->TexHeight) {
                iVar103 = pIVar101->TexHeight;
              }
              pIVar101->TexHeight = iVar103;
            }
            lVar86 = lVar86 + 0x10;
          } while (lVar105 * 0x10 != lVar86);
        }
      }
      lVar106 = lVar106 + 1;
    } while (lVar106 != lVar80);
  }
  uVar102 = pIVar101->TexHeight;
  if ((pIVar101->Flags & 1) == 0) {
    uVar102 = (int)(uVar102 - 1) >> 1 | uVar102 - 1;
    uVar102 = (int)uVar102 >> 2 | uVar102;
    uVar102 = (int)uVar102 >> 4 | uVar102;
    uVar102 = (int)uVar102 >> 8 | uVar102;
    uVar102 = (int)uVar102 >> 0x10 | uVar102;
  }
  iVar103 = uVar102 + 1;
  pIVar101->TexHeight = iVar103;
  auVar110._0_4_ = (float)pIVar101->TexWidth;
  auVar110._4_4_ = (float)iVar103;
  auVar110._8_8_ = 0;
  auVar125 = divps(_DAT_0018d0e0,auVar110);
  pIVar101->TexUvScale = auVar125._0_8_;
  puVar75 = (uchar *)ImGui::MemAlloc((long)(iVar103 * pIVar101->TexWidth));
  pIVar101->TexPixelsAlpha8 = puVar75;
  memset(puVar75,0,(long)pIVar101->TexHeight * (long)pIVar101->TexWidth);
  if (0 < (int)uVar14) {
    local_3a0 = pIVar101->TexPixelsAlpha8;
    lVar106 = (long)(int)local_498._12_4_;
    local_68 = pshuflw(ZEXT416(uVar68),ZEXT416(uVar68),0);
    lVar95 = 0;
    auVar136 = _DAT_00193ce0;
    auVar125 = _DAT_00193c90;
    do {
      uVar148 = 0x80000000;
      uVar147 = 0x80000000;
      uVar146 = 0x80000000;
      local_3b0 = lVar95;
      if ((pIVar101->ConfigData).Size <= lVar95) goto LAB_00164cbf;
      if (*(int *)((long)local_4d0 + lVar95 * 0x110 + 0xe8) != 0) {
        psVar104 = (stbtt_fontinfo *)(lVar95 * 0x110 + (long)local_4d0);
        fVar98 = *(float *)&psVar104[1].userdata;
        if (fVar98 <= 0.0) {
          fVar98 = -fVar98;
          uVar68 = (uint)(ushort)(*(ushort *)(psVar104->data + (long)psVar104->head + 0x12) << 8 |
                                 *(ushort *)(psVar104->data + (long)psVar104->head + 0x12) >> 8);
        }
        else {
          puVar75 = psVar104->data;
          lVar95 = (long)psVar104->hhea;
          uVar68 = ((int)(short)((ushort)puVar75[lVar95 + 4] << 8) | (uint)puVar75[lVar95 + 5]) -
                   ((int)(short)((ushort)puVar75[lVar95 + 6] << 8) | (uint)puVar75[lVar95 + 7]);
          uVar146 = 0;
          uVar147 = 0;
          uVar148 = 0;
        }
        fVar98 = fVar98 / (float)(int)uVar68;
        local_300 = (pIVar101->ConfigData).Data;
        if (0 < psVar104[1].fontstart) {
          lVar95._0_4_ = psVar104[1].hmtx;
          lVar95._4_4_ = psVar104[1].kern;
          local_298._0_4_ = psVar104[1].glyf;
          local_298._4_4_ = psVar104[1].hhea;
          uStack_290 = 0;
          auVar48._8_6_ = 0;
          auVar48._0_8_ = local_298;
          auVar48[0xe] = (char)((uint)local_298._4_4_ >> 0x18);
          auVar51._8_4_ = 0;
          auVar51._0_8_ = local_298;
          auVar51[0xc] = (char)((uint)local_298._4_4_ >> 0x10);
          auVar51._13_2_ = auVar48._13_2_;
          auVar52._8_4_ = 0;
          auVar52._0_8_ = local_298;
          auVar52._12_3_ = auVar51._12_3_;
          auVar53._8_2_ = 0;
          auVar53._0_8_ = local_298;
          auVar53[10] = (char)((uint)local_298._4_4_ >> 8);
          auVar53._11_4_ = auVar52._11_4_;
          auVar54._8_2_ = 0;
          auVar54._0_8_ = local_298;
          auVar54._10_5_ = auVar53._10_5_;
          auVar55[8] = (char)local_298._4_4_;
          auVar55._0_8_ = local_298;
          auVar55._9_6_ = auVar54._9_6_;
          cVar121 = (char)((uint)(undefined4)local_298 >> 0x18);
          Var38 = CONCAT91((unkuint9)auVar55._8_7_ << 8,cVar121);
          auVar46[10] = 0;
          auVar46._0_10_ = Var38;
          cVar120 = (char)((uint)(undefined4)local_298 >> 0x10);
          auVar202._1_11_ = auVar46 << 8;
          auVar202[0] = cVar120;
          auVar45[0xc] = 0;
          auVar45._0_12_ = auVar202;
          bVar119 = (byte)((uint)(undefined4)local_298 >> 8);
          auVar37._1_13_ = auVar45 << 8;
          auVar37[0] = bVar119;
          bVar108 = (byte)(undefined4)local_298;
          auVar111._0_2_ = CONCAT11(0,bVar108);
          auVar111._2_14_ = auVar37;
          uVar59 = auVar37._0_2_;
          sVar34 = -auVar202._0_2_;
          uVar123 = (ushort)Var38;
          sVar60 = -uVar123;
          auVar49._10_2_ = 0;
          auVar49._0_10_ = auVar111._0_10_;
          auVar49._12_2_ = uVar123;
          uVar56 = CONCAT42(auVar49._10_4_,auVar202._0_2_);
          auVar112._4_2_ = uVar59;
          auVar112._0_4_ = auVar111._0_4_;
          auVar112._6_10_ = (unkuint10)uVar56 << 0x10;
          auVar113._0_4_ = (float)auVar111._0_2_;
          auVar113._4_4_ = (float)auVar112._4_4_;
          auVar113._8_4_ = (float)(int)uVar56;
          auVar113._12_4_ = (float)uVar123;
          local_58 = divps(_DAT_0018d0e0,auVar113);
          auVar150[0] = -(bVar108 == 0);
          auVar150[1] = -(bVar108 == 0);
          auVar150[2] = -(bVar108 == 0);
          auVar150[3] = -(bVar108 == 0);
          auVar150[4] = -(bVar119 == 0);
          auVar150[5] = -(bVar119 == 0);
          auVar150[6] = -(bVar119 == 0);
          auVar150[7] = -(bVar119 == 0);
          auVar150[8] = -(cVar120 == '\0');
          auVar150[9] = -(cVar120 == '\0');
          auVar150[10] = -(cVar120 == '\0');
          auVar150[0xb] = -(cVar120 == '\0');
          auVar150[0xc] = -(cVar121 == '\0');
          auVar150[0xd] = -(cVar121 == '\0');
          auVar150[0xe] = -(cVar121 == '\0');
          auVar150[0xf] = -(cVar121 == '\0');
          Var43 = CONCAT64(CONCAT42(CONCAT22(sVar60,sVar60),sVar34),CONCAT22(sVar34,sVar60));
          auVar39._4_8_ = (long)((unkuint10)Var43 >> 0x10);
          auVar39._2_2_ = 1 - uVar59;
          auVar39._0_2_ = 1 - uVar59;
          auVar126._0_4_ = (float)(int)(short)(1 - auVar111._0_2_);
          auVar126._4_4_ = (float)(auVar39._0_4_ >> 0x10);
          auVar126._8_4_ = (float)((int)((unkuint10)Var43 >> 0x10) >> 0x10);
          auVar126._12_4_ = (float)(int)sVar60;
          local_2a8._0_4_ = fVar98 * auVar113._0_4_;
          local_2a8._4_4_ = fVar98 * auVar113._4_4_;
          local_2a8._8_4_ = fVar98 * auVar113._8_4_;
          local_2a8._12_4_ = fVar98 * auVar113._12_4_;
          auVar114._0_4_ = auVar113._0_4_ + auVar113._0_4_;
          auVar114._4_4_ = auVar113._4_4_ + auVar113._4_4_;
          auVar114._8_4_ = auVar113._8_4_ + auVar113._8_4_;
          auVar114._12_4_ = auVar113._12_4_ + auVar113._12_4_;
          auVar127 = divps(auVar126,auVar114);
          local_48._0_16_ = ~auVar150 & auVar127;
          fVar109 = local_2a8._4_4_;
          if ((float)local_2a8._0_4_ <= local_2a8._4_4_) {
            fVar109 = (float)local_2a8._0_4_;
          }
          local_3b4 = (0.35 / fVar109) * (0.35 / fVar109);
          local_2b8 = local_2a8._4_4_;
          fStack_2b4 = local_2a8._4_4_;
          fStack_2b0 = local_2a8._4_4_;
          fStack_2ac = local_2a8._4_4_;
          local_310 = local_298 & 0xff;
          local_318 = (ulong)bVar119;
          local_430 = (ulong)(auVar111._0_4_ & 0xffff);
          uVar71 = CONCAT44(local_2a8._4_4_,local_2a8._0_4_);
          local_78._0_8_ = uVar71 ^ 0x8000000000000000;
          local_78._8_4_ = local_2a8._0_4_;
          local_78._12_4_ = -local_2a8._4_4_;
          lVar105 = 0;
          local_478 = fVar98;
          uStack_474 = uVar146;
          uStack_470 = uVar147;
          uStack_46c = uVar148;
          local_2f8 = lVar95;
          local_330 = psVar104;
          local_3c0 = (ulong)uVar59;
          do {
            if (((*(int *)(lVar95 + 0xc + lVar105 * 0x10) != 0) &&
                (lVar86 = lVar105 * 0x10 + lVar95, *(short *)(lVar86 + 4) != 0)) &&
               (*(short *)(lVar86 + 6) != 0)) {
              if (psVar104[1].data == (uchar *)0x0) {
                iVar103 = *(int *)((long)&psVar104[1].userdata + 4) + (int)lVar105;
              }
              else {
                iVar103 = *(int *)(psVar104[1].data + lVar105 * 4);
              }
              local_2f0 = (undefined4 *)(lVar105 * 0x1c + *(long *)&psVar104[1].loca);
              local_2e8 = lVar105;
              iVar69 = stbtt_FindGlyphIndex(psVar104,iVar103);
              fVar98 = auVar136._0_4_;
              uVar166 = *(undefined8 *)(lVar86 + 4);
              *(ulong *)(lVar86 + 4) =
                   CONCAT44(CONCAT22((short)((ulong)uVar166 >> 0x30) + local_68._6_2_,
                                     (short)((ulong)uVar166 >> 0x20) + local_68._4_2_),
                            CONCAT22((short)((ulong)uVar166 >> 0x10) - local_68._2_2_,
                                     (short)uVar166 - local_68._0_2_));
              puVar75 = psVar104->data;
              uVar59 = *(ushort *)(puVar75 + (long)psVar104->hhea + 0x22) << 8 |
                       *(ushort *)(puVar75 + (long)psVar104->hhea + 0x22) >> 8;
              iVar103 = psVar104->hmtx;
              lVar95 = (ulong)uVar59 * 4 + (long)iVar103 + -4;
              lVar105 = (ulong)uVar59 * 4 + (long)iVar103 + -3;
              if (iVar69 < (int)(uint)uVar59) {
                lVar95 = (long)(iVar69 * 4) + (long)iVar103;
                lVar105 = (long)(iVar69 * 4) + 1 + (long)iVar103;
              }
              local_360 = (uint)puVar75[lVar95];
              local_364 = (uint)puVar75[lVar105];
              auVar136 = local_68;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psVar104,iVar69,(float)local_2a8._0_4_,local_2b8,local_68._0_4_,fVar98,
                         &local_350,&local_354,&local_2bc,&local_2c0);
              auVar125 = local_3e8;
              fVar109 = auVar136._0_4_;
              local_3e8._2_6_ = 0;
              local_3e8._0_2_ = *(ushort *)(lVar86 + 8);
              local_3e8._8_8_ = auVar125._8_8_;
              local_390 = (uchar *)(ulong)*(ushort *)(lVar86 + 10);
              local_400 = (ulong)*(ushort *)(lVar86 + 4);
              local_3a8 = (ulong)*(ushort *)(lVar86 + 6);
              local_398 = lVar86;
              uVar68 = stbtt_GetGlyphShape(psVar104,iVar69,(stbtt_vertex **)&local_3f8);
              uVar102 = ((int)local_400 - (int)local_430) + 1;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (local_330,iVar69,(float)local_2a8._0_4_,local_2b8,fVar109,fVar98,
                         (int *)&local_49c,&local_34c,(int *)0x0,(int *)0x0);
              if ((uVar102 != 0) && (iVar103 = ((int)local_3a8 - (int)local_3c0) + 1, iVar103 != 0))
              {
                lVar95 = CONCAT44(local_3f8._4_4_,(stbtt_uint32)local_3f8);
                local_288[0].data = (uchar *)((ulong)local_288[0].data & 0xffffffff00000000);
                if ((int)uVar68 < 1) {
                  uVar71 = 0;
                }
                else {
                  lVar105 = 0;
                  uVar71 = 0;
                  do {
                    uVar71 = (ulong)((int)uVar71 +
                                    (uint)(*(char *)(lVar95 + 0xc + lVar105) == '\x01'));
                    lVar105 = lVar105 + 0xe;
                  } while ((ulong)uVar68 * 0xe != lVar105);
                }
                local_3b8 = local_34c;
                local_488._0_8_ = uVar71;
                sVar67 = local_49c;
                if ((int)uVar71 == 0) {
LAB_00162e97:
                  local_450 = (void *)0x0;
LAB_00162ea3:
                  points = (stbtt__point *)0x0;
                }
                else {
                  local_450 = ImGui::MemAlloc((long)(int)uVar71 << 2);
                  if (local_450 == (void *)0x0) {
                    auVar40._8_8_ = 0;
                    auVar40._0_8_ = local_488._8_8_;
                    local_488 = auVar40 << 0x40;
                    goto LAB_00162ea3;
                  }
                  lVar105 = (ulong)uVar68 * 0xe;
                  uVar71 = 0;
                  iVar69 = 0;
                  points = (stbtt__point *)0x0;
                  auVar115._0_8_ = lVar105;
                  do {
                    if ((int)uVar71 == 0) {
LAB_00162c59:
                      local_288[0].data = (uchar *)((ulong)local_288[0].data & 0xffffffff00000000);
                      if ((int)uVar68 < 1) {
                        lVar86 = -1;
                      }
                      else {
                        local_448._0_8_ = uVar71;
                        fVar98 = 0.0;
                        fVar109 = 0.0;
                        uVar70 = 0xffffffff;
                        lVar86 = 0;
                        do {
                          puVar75 = local_288[0].data;
                          switch(*(undefined1 *)(lVar95 + 0xc + lVar86)) {
                          case 1:
                            if (-1 < (int)uVar70) {
                              *(int *)((long)local_450 + (ulong)uVar70 * 4) =
                                   (int)local_288[0].data - iVar69;
                            }
                            uVar70 = uVar70 + 1;
                            auVar125 = pshuflw(ZEXT416(*(uint *)(lVar95 + lVar86)),
                                               ZEXT416(*(uint *)(lVar95 + lVar86)),0x60);
                            iVar92 = auVar125._0_4_;
                            iVar79 = auVar125._4_4_;
                            iVar69 = (int)local_288[0].data;
                            break;
                          case 2:
                            auVar125 = pshuflw(ZEXT416(*(uint *)(lVar95 + lVar86)),
                                               ZEXT416(*(uint *)(lVar95 + lVar86)),0x60);
                            iVar92 = auVar125._0_4_;
                            iVar79 = auVar125._4_4_;
                            break;
                          case 3:
                            stbtt__tesselate_curve
                                      (points,(int *)local_288,fVar98,fVar109,
                                       (float)(int)*(short *)(lVar95 + 4 + lVar86),
                                       (float)(int)*(short *)(lVar95 + 6 + lVar86),
                                       (float)(int)*(short *)(lVar95 + lVar86),
                                       (float)(int)*(short *)(lVar95 + 2 + lVar86),local_3b4,0);
                            goto LAB_00162dc8;
                          case 4:
                            stbtt__tesselate_cubic
                                      (points,(int *)local_288,fVar98,fVar109,
                                       (float)(int)*(short *)(lVar95 + 4 + lVar86),
                                       (float)(int)*(short *)(lVar95 + 6 + lVar86),
                                       (float)(int)*(short *)(lVar95 + 8 + lVar86),
                                       (float)(int)*(short *)(lVar95 + 10 + lVar86),
                                       (float)(int)*(short *)(lVar95 + lVar86),
                                       (float)(int)*(short *)(lVar95 + 2 + lVar86),local_3b4,0);
LAB_00162dc8:
                            lVar105 = auVar115._0_8_;
                            auVar125 = pshuflw(ZEXT416(*(uint *)(lVar95 + lVar86)),
                                               ZEXT416(*(uint *)(lVar95 + lVar86)),0x60);
                            fVar98 = (float)(auVar125._0_4_ >> 0x10);
                            fVar109 = (float)(auVar125._4_4_ >> 0x10);
                            puVar75 = local_288[0].data;
                          default:
                            goto switchD_00162c9f_default;
                          }
                          puVar75 = (uchar *)CONCAT44(local_288[0].data._4_4_,
                                                      (int)local_288[0].data + 1);
                          fVar109 = (float)(iVar79 >> 0x10);
                          fVar98 = (float)(iVar92 >> 0x10);
                          if (points != (stbtt__point *)0x0) {
                            points[(int)local_288[0].data].x = fVar98;
                            points[(int)local_288[0].data].y = fVar109;
                          }
switchD_00162c9f_default:
                          local_288[0].data = puVar75;
                          lVar86 = lVar86 + 0xe;
                        } while (lVar105 != lVar86);
                        lVar86 = (long)(int)uVar70;
                        uVar71 = local_448._0_8_;
                      }
                      *(int *)((long)local_450 + lVar86 * 4) = (int)local_288[0].data - iVar69;
                      bVar58 = true;
                    }
                    else {
                      points = (stbtt__point *)ImGui::MemAlloc((long)(int)local_288[0].data << 3);
                      lVar105 = auVar115._0_8_;
                      if (points != (stbtt__point *)0x0) goto LAB_00162c59;
                      points = (stbtt__point *)0x0;
                      bVar58 = false;
                    }
                    if (!bVar58) {
                      ImGui::MemFree(points);
                      ImGui::MemFree(local_450);
                      auVar41._8_8_ = 0;
                      auVar41._0_8_ = local_488._8_8_;
                      local_488 = auVar41 << 0x40;
                      goto LAB_00162e97;
                    }
                    iVar92 = (int)uVar71;
                    uVar71 = (ulong)(iVar92 + 1);
                  } while (iVar92 == 0);
                }
                if (points != (stbtt__point *)0x0) {
                  uVar71 = local_488._0_8_ & 0xffffffff;
                  if (local_488._0_4_ < 1) {
                    size = 0x14;
                  }
                  else {
                    uVar81 = 0;
                    lVar95 = 0;
                    do {
                      lVar95 = (long)(int)lVar95 + (long)*(int *)((long)local_450 + uVar81 * 4);
                      uVar81 = uVar81 + 1;
                    } while (uVar71 != uVar81);
                    size = lVar95 * 0x14 + 0x14;
                  }
                  p_00 = (stbtt__edge *)ImGui::MemAlloc(size);
                  local_3c8 = p_00;
                  if (p_00 != (stbtt__edge *)0x0) {
                    if ((int)local_488._0_4_ < 1) {
                      uVar68 = 0;
                    }
                    else {
                      uVar81 = 0;
                      uVar68 = 0;
                      iVar69 = 0;
                      do {
                        iVar92 = *(int *)((long)local_450 + uVar81 * 4);
                        if (0 < iVar92) {
                          uVar87 = (ulong)(iVar92 - 1);
                          uVar93 = 0;
                          do {
                            iVar79 = (int)uVar87;
                            fVar98 = points[(long)iVar69 + (long)iVar79].y;
                            fVar109 = points[(long)iVar69 + uVar93].y;
                            if ((fVar98 != fVar109) || (NAN(fVar98) || NAN(fVar109))) {
                              iVar97 = (int)uVar93;
                              iVar99 = iVar79;
                              if (fVar98 <= fVar109) {
                                iVar99 = iVar97;
                                iVar97 = iVar79;
                              }
                              p_00[(int)uVar68].invert = (uint)(fVar109 < fVar98);
                              sVar6 = points[(long)iVar69 + (long)iVar99];
                              sVar7 = points[(long)iVar69 + (long)iVar97];
                              psVar2 = p_00 + (int)uVar68;
                              psVar2->x0 = sVar6.x * local_78._0_4_ + 0.0;
                              psVar2->y0 = sVar6.y * local_78._4_4_ + 0.0;
                              psVar2->x1 = sVar7.x * local_78._8_4_ + 0.0;
                              psVar2->y1 = sVar7.y * local_78._12_4_ + 0.0;
                              uVar68 = uVar68 + 1;
                            }
                            uVar87 = uVar93 & 0xffffffff;
                            uVar93 = uVar93 + 1;
                          } while ((long)uVar93 < (long)*(int *)((long)local_450 + uVar81 * 4));
                        }
                        iVar69 = iVar69 + iVar92;
                        uVar81 = uVar81 + 1;
                      } while (uVar81 != uVar71);
                    }
                    local_328 = points;
                    stbtt__sort_edges_quicksort(p_00,uVar68);
                    if (1 < (int)uVar68) {
                      uVar71 = 1;
                      do {
                        uVar3 = p_00[uVar71].x0;
                        uVar8 = p_00[uVar71].y0;
                        iVar69 = p_00[uVar71].invert;
                        local_288[0].cursor = iVar69;
                        local_288[0].data = *(uchar **)&p_00[uVar71].x1;
                        uVar81 = uVar71 & 0xffffffff;
                        do {
                          uVar70 = (uint)uVar81;
                          if ((int)uVar70 < 1) break;
                          fVar98 = p_00[uVar81 - 1].y0;
                          if ((float)uVar8 < fVar98) {
                            psVar2 = p_00 + uVar81;
                            psVar2->invert = psVar2[-1].invert;
                            fVar109 = psVar2[-1].y0;
                            fVar153 = psVar2[-1].x1;
                            fVar154 = psVar2[-1].y1;
                            psVar2->x0 = psVar2[-1].x0;
                            psVar2->y0 = fVar109;
                            psVar2->x1 = fVar153;
                            psVar2->y1 = fVar154;
                            uVar81 = (ulong)(uVar70 - 1);
                          }
                          uVar70 = (uint)uVar81;
                        } while ((float)uVar8 < fVar98);
                        if (uVar71 != uVar70) {
                          p_00[(int)uVar70].x0 = (float)uVar3;
                          p_00[(int)uVar70].y0 = (float)uVar8;
                          *(uchar **)&p_00[(int)uVar70].x1 = local_288[0].data;
                          p_00[(int)uVar70].invert = iVar69;
                        }
                        uVar71 = uVar71 + 1;
                      } while (uVar71 != uVar68);
                    }
                    uVar70 = (int)local_400 - (int)local_430;
                    local_400 = (ulong)uVar70;
                    local_498._0_8_ = (stbtt__active_edge *)0x0;
                    scanline = local_288;
                    if (0x3f < (int)uVar70) {
                      scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)uVar102 * 8 + 4);
                      p_00 = local_3c8;
                    }
                    uVar70 = (int)local_3a8 - (int)local_3c0;
                    local_3a8 = (ulong)uVar70;
                    p_00[(int)uVar68].y0 = (float)(iVar103 + local_3b8) + 1.0;
                    if (uVar70 < 0x7fffffff) {
                      local_390 = local_3a0 + (long)local_390 * lVar106 + local_3e8._0_8_;
                      local_358 = (float)(int)sVar67;
                      local_2e0 = (long)(int)uVar102;
                      local_378 = (float *)((long)&scanline->data + local_2e0 * 4);
                      local_320 = local_378 + 1;
                      local_2d0 = local_2e0 * 4;
                      local_3ec = (float)(int)uVar102;
                      local_2d8 = (long)(int)(uint)local_400 * 4 + 8;
                      local_388 = 0;
                      local_380 = 0;
                      local_3d0 = (undefined8 *)0x0;
                      local_424 = 0;
                      psVar100 = (stbtt__active_edge *)0x0;
                      iVar103 = local_3b8;
                      do {
                        fVar98 = (float)iVar103;
                        fVar109 = fVar98 + 1.0;
                        local_35c = iVar103;
                        memset(scanline,0,local_2d0);
                        memset(local_378,0,local_2d8);
                        if ((stbtt__active_edge *)local_498._0_8_ != (stbtt__active_edge *)0x0) {
                          psVar77 = (stbtt__active_edge *)local_498._0_8_;
                          psVar84 = (stbtt__active_edge *)local_498;
                          do {
                            psVar85 = psVar77;
                            if (psVar77->ey <= fVar98) {
                              psVar84->next = psVar77->next;
                              if ((psVar77->direction == 0.0) && (!NAN(psVar77->direction))) {
                                __assert_fail("z->direction",
                                              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                                              ,0xc63,
                                              "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                             );
                              }
                              psVar77->direction = 0.0;
                              psVar77->next = psVar100;
                              psVar85 = psVar84;
                              psVar100 = psVar77;
                            }
                            psVar77 = psVar85->next;
                            psVar84 = psVar85;
                          } while (psVar77 != (stbtt__active_edge *)0x0);
                        }
                        fVar153 = p_00->y0;
                        if (fVar153 <= fVar109) {
                          bVar58 = local_3b8 != 0;
                          bVar107 = (int)local_380 == 0;
                          do {
                            if ((fVar153 != p_00->y1) || (NAN(fVar153) || NAN(p_00->y1))) {
                              if (psVar100 == (stbtt__active_edge *)0x0) {
                                psVar77 = psVar100;
                                if (local_424 == 0) {
                                  puVar78 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                  if (puVar78 == (undefined8 *)0x0) {
                                    psVar100 = (stbtt__active_edge *)0x0;
                                    goto LAB_001639fc;
                                  }
                                  *puVar78 = local_3d0;
                                  local_424 = 800;
                                  local_3d0 = puVar78;
                                }
                                lVar95 = (long)local_424;
                                local_424 = local_424 + -1;
                                psVar100 = (stbtt__active_edge *)(local_3d0 + lVar95 * 4 + -3);
                              }
                              else {
                                psVar77 = psVar100->next;
                              }
LAB_001639fc:
                              if (psVar100 == (stbtt__active_edge *)0x0) {
                                __assert_fail("z != __null",
                                              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                                              ,0xad1,
                                              "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                             );
                              }
                              uVar4 = p_00->x0;
                              uVar9 = p_00->y0;
                              uVar5 = p_00->x1;
                              uVar10 = p_00->y1;
                              fVar153 = ((float)uVar5 - (float)uVar4) /
                                        ((float)uVar10 - (float)uVar9);
                              psVar100->fdx = fVar153;
                              psVar100->fdy =
                                   (float)(-(uint)(fVar153 != 0.0) & (uint)(1.0 / fVar153));
                              psVar100->fx = ((fVar98 - (float)uVar9) * fVar153 + (float)uVar4) -
                                             local_358;
                              psVar100->direction =
                                   *(float *)(&DAT_00193d94 + (ulong)(p_00->invert == 0) * 4);
                              psVar100->sy = (float)uVar9;
                              psVar100->ey = (float)uVar10;
                              psVar100->next = (stbtt__active_edge *)0x0;
                              if ((float)uVar10 < fVar98 && (bVar107 && bVar58)) {
                                psVar100->ey = fVar98;
                              }
                              if (psVar100->ey < fVar98) {
                                __assert_fail("z->ey >= scan_y_top",
                                              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                                              ,0xc76,
                                              "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                             );
                              }
                              psVar100->next = (stbtt__active_edge *)local_498._0_8_;
                              local_498._0_8_ = psVar100;
                              psVar100 = psVar77;
                            }
                            fVar153 = p_00[1].y0;
                            p_00 = p_00 + 1;
                          } while (fVar153 <= fVar109);
                        }
                        if ((stbtt__active_edge *)local_498._0_8_ != (stbtt__active_edge *)0x0) {
                          local_2c8 = psVar100;
                          psVar77 = (stbtt__active_edge *)local_498._0_8_;
                          do {
                            fVar153 = psVar77->ey;
                            if (fVar153 < fVar98) {
                              __assert_fail("e->ey >= y_top",
                                            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                                            ,0xba5,
                                            "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                           );
                            }
                            fVar154 = psVar77->fx;
                            auVar157._0_8_ = CONCAT44(0,fVar154);
                            auVar157._8_8_ = 0;
                            fVar155 = psVar77->fdx;
                            if ((fVar155 != 0.0) || (NAN(fVar155))) {
                              fVar156 = psVar77->sy;
                              if (fVar109 < fVar156) {
                                __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                                              ,3000,
                                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                             );
                              }
                              fVar162 = fVar155 + fVar154;
                              fVar161 = (float)(~-(uint)(fVar98 < fVar156) & (uint)fVar154 |
                                               (uint)((fVar156 - fVar98) * fVar155 + fVar154) &
                                               -(uint)(fVar98 < fVar156));
                              if ((((fVar161 < 0.0) ||
                                   (fVar163 = (float)(~-(uint)(fVar153 < fVar109) & (uint)fVar162 |
                                                     (uint)((fVar153 - fVar98) * fVar155 + fVar154)
                                                     & -(uint)(fVar153 < fVar109)), fVar163 < 0.0))
                                  || (local_3ec <= fVar161)) || (local_3ec <= fVar163)) {
                                if ((uint)local_400 < 0x7fffffff) {
                                  local_370 = CONCAT44(local_370._4_4_,fVar155);
                                  local_3e8 = ZEXT416((uint)fVar162);
                                  local_348 = auVar157;
                                  uVar68 = 0;
                                  do {
                                    fVar154 = (float)(int)uVar68;
                                    uVar70 = uVar68 + 1;
                                    fVar161 = (float)(int)uVar70;
                                    fVar156 = local_348._0_4_;
                                    fVar153 = (fVar154 - fVar156) / fVar155 + fVar98;
                                    fVar155 = (fVar161 - fVar156) / fVar155 + fVar98;
                                    auVar115._0_4_ = fVar153;
                                    local_448._0_4_ = fVar154;
                                    fVar162 = local_3e8._0_4_;
                                    if ((fVar154 <= fVar156) || (fVar162 <= fVar161)) {
                                      if ((fVar154 <= fVar162) || (fVar156 <= fVar161)) {
                                        fVar163 = fVar98;
                                        if (((fVar154 <= fVar156) || (fVar162 <= fVar154)) &&
                                           ((fVar154 <= fVar162 || (fVar156 <= fVar154)))) {
                                          if (((fVar156 < fVar161) && (fVar161 < fVar162)) ||
                                             ((fVar153 = fVar98, fVar162 < fVar161 &&
                                              (fVar161 < fVar156)))) {
                                            local_488._0_4_ = fVar155;
                                            fVar153 = fVar98;
                                            goto LAB_00163535;
                                          }
                                          goto LAB_001635ef;
                                        }
                                      }
                                      else {
                                        local_488._0_4_ = fVar155;
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar68,psVar77,fVar156,fVar98,
                                                   fVar161,fVar155);
                                        fVar153 = auVar115._0_4_;
                                        fVar156 = fVar161;
                                        fVar154 = (float)local_448._0_4_;
                                        fVar163 = (float)local_488._0_4_;
                                      }
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar68,psVar77,fVar156,fVar163,
                                                 fVar154,fVar153);
                                      fVar153 = auVar115._0_4_;
                                      fVar156 = (float)local_448._0_4_;
                                    }
                                    else {
                                      local_488._0_4_ = fVar155;
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar68,psVar77,fVar156,fVar98,
                                                 fVar154,fVar153);
                                      fVar156 = (float)local_448._0_4_;
                                      fVar155 = (float)local_488._0_4_;
                                      fVar153 = auVar115._0_4_;
LAB_00163535:
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar68,psVar77,fVar156,fVar153,
                                                 fVar161,fVar155);
                                      fVar156 = fVar161;
                                      fVar153 = (float)local_488._0_4_;
                                    }
LAB_001635ef:
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar68,psVar77,fVar156,fVar153,
                                               local_3e8._0_4_,fVar109);
                                    fVar155 = (float)local_370;
                                    uVar68 = uVar70;
                                  } while (uVar102 != uVar70);
                                }
                              }
                              else {
                                if (fVar156 <= fVar98) {
                                  fVar156 = fVar98;
                                }
                                uVar68 = (uint)fVar161;
                                if (fVar109 <= fVar153) {
                                  fVar153 = fVar109;
                                }
                                if (uVar68 == (int)fVar163) {
                                  if (((int)uVar68 < 0) || ((int)(uint)local_400 < (int)uVar68)) {
                                    __assert_fail("x >= 0 && x < len",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                                                  ,0xbd4,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  uVar71 = (ulong)uVar68;
                                  *(float *)((long)&scanline->data + uVar71 * 4) =
                                       (((fVar163 - (float)(int)uVar68) +
                                        (fVar161 - (float)(int)uVar68)) * -0.5 + 1.0) *
                                       psVar77->direction * (fVar153 - fVar156) +
                                       *(float *)((long)&scanline->data + uVar71 * 4);
                                  fVar154 = (fVar153 - fVar156) * psVar77->direction;
                                }
                                else {
                                  fVar155 = psVar77->fdy;
                                  fVar164 = fVar163;
                                  if (fVar163 < fVar161) {
                                    fVar154 = fVar98 - fVar156;
                                    fVar156 = (fVar98 - fVar153) + fVar109;
                                    fVar155 = -fVar155;
                                    fVar164 = fVar161;
                                    fVar153 = fVar154 + fVar109;
                                    fVar161 = fVar163;
                                    fVar154 = fVar162;
                                  }
                                  iVar69 = (int)fVar164;
                                  iVar103 = (int)fVar161 + 1;
                                  fVar163 = ((float)iVar103 - fVar154) * fVar155 + fVar98;
                                  fVar154 = psVar77->direction;
                                  fVar162 = (fVar163 - fVar156) * fVar154;
                                  lVar95 = (long)(int)fVar161;
                                  *(float *)((long)&scanline->data + lVar95 * 4) =
                                       (((fVar161 - (float)(int)fVar161) + 1.0) * -0.5 + 1.0) *
                                       fVar162 + *(float *)((long)&scanline->data + lVar95 * 4);
                                  if (iVar69 - iVar103 != 0 && iVar103 <= iVar69) {
                                    do {
                                      *(float *)((long)&scanline->data + lVar95 * 4 + 4) =
                                           fVar155 * fVar154 * 0.5 + fVar162 +
                                           *(float *)((long)&scanline->data + lVar95 * 4 + 4);
                                      fVar162 = fVar162 + fVar155 * fVar154;
                                      lVar95 = lVar95 + 1;
                                    } while (iVar69 + -1 != (int)lVar95);
                                  }
                                  if (1.01 < ABS(fVar162)) {
                                    __assert_fail("fabsf(area) <= 1.01f",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                                                  ,0xbfb,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  uVar71 = (ulong)iVar69;
                                  *(float *)((long)&scanline->data + uVar71 * 4) =
                                       (fVar153 - (fVar155 * (float)(iVar69 - iVar103) + fVar163)) *
                                       (((fVar164 - (float)iVar69) + 0.0) * -0.5 + 1.0) * fVar154 +
                                       fVar162 + *(float *)((long)&scanline->data + uVar71 * 4);
                                  fVar154 = (fVar153 - fVar156) * fVar154;
                                }
                                local_320[uVar71] = fVar154 + local_320[uVar71];
                              }
                            }
                            else if (fVar154 < local_3ec) {
                              if (0.0 <= fVar154) {
                                local_348 = auVar157;
                                stbtt__handle_clipped_edge
                                          ((float *)scanline,(int)fVar154,psVar77,fVar154,fVar98,
                                           fVar154,fVar109);
                                iVar103 = (int)fVar154 + 1;
                                auVar137 = local_348;
                              }
                              else {
                                iVar103 = 0;
                                auVar137._8_8_ = 0;
                                auVar137._0_8_ = auVar157._0_8_;
                              }
                              stbtt__handle_clipped_edge
                                        (local_378,iVar103,psVar77,auVar137._0_4_,fVar98,
                                         auVar137._0_4_,fVar109);
                            }
                            psVar77 = psVar77->next;
                            psVar100 = local_2c8;
                          } while (psVar77 != (stbtt__active_edge *)0x0);
                        }
                        uVar68 = (uint)DAT_0018d020;
                        psVar77 = (stbtt__active_edge *)local_498._0_8_;
                        if ((uint)local_400 < 0x7fffffff) {
                          fVar98 = 0.0;
                          psVar76 = scanline;
                          uVar71 = local_388;
                          lVar95 = local_2e0;
                          do {
                            fVar98 = fVar98 + *(float *)((long)&psVar76->data + local_2e0 * 4);
                            iVar103 = (int)((float)((uint)(*(float *)&psVar76->data + fVar98) &
                                                   uVar68) * 255.0 + 0.5);
                            uVar91 = (uchar)iVar103;
                            if (0xfe < iVar103) {
                              uVar91 = 0xff;
                            }
                            local_390[(int)uVar71] = uVar91;
                            uVar71 = (ulong)((int)uVar71 + 1);
                            psVar76 = (stbtt__buf *)((long)&psVar76->data + 4);
                            lVar95 = lVar95 + -1;
                          } while (lVar95 != 0);
                        }
                        for (; psVar77 != (stbtt__active_edge *)0x0; psVar77 = psVar77->next) {
                          psVar77->fx = psVar77->fdx + psVar77->fx;
                        }
                        iVar103 = local_35c + 1;
                        iVar69 = (int)local_380;
                        local_380 = (ulong)(iVar69 + 1);
                        local_388 = (ulong)(uint)((int)local_388 + local_498._12_4_);
                        puVar78 = local_3d0;
                        psVar44 = local_328;
                      } while (iVar69 != (int)local_3a8);
                    }
                    else {
                      local_3d0 = (undefined8 *)0x0;
                      puVar78 = local_3d0;
                      psVar44 = local_328;
                    }
                    while (points = local_328, local_328 = psVar44, puVar78 != (undefined8 *)0x0) {
                      puVar17 = (undefined8 *)*puVar78;
                      ImGui::MemFree(puVar78);
                      puVar78 = puVar17;
                      psVar44 = local_328;
                      local_328 = points;
                    }
                    if (scanline != local_288) {
                      ImGui::MemFree(scanline);
                    }
                    ImGui::MemFree(local_3c8);
                  }
                  ImGui::MemFree(local_450);
                  ImGui::MemFree(points);
                }
              }
              ImGui::MemFree((void *)CONCAT44(local_3f8._4_4_,(stbtt_uint32)local_3f8));
              auVar136 = _DAT_00193ce0;
              auVar125 = _DAT_00193c90;
              if (1 < (byte)local_310) {
                uVar59 = *(ushort *)(local_398 + 4);
                local_288[0].data = (uchar *)0x0;
                uVar68 = CONCAT22(0,*(ushort *)(local_398 + 6));
                auVar115._0_4_ = uVar68;
                if (uVar68 != 0) {
                  puVar75 = local_3a0 +
                            (ulong)*(ushort *)(local_398 + 10) * lVar106 +
                            (ulong)*(ushort *)(local_398 + 8);
                  iVar69 = (uint)uVar59 - (int)local_430;
                  uVar71 = (ulong)(iVar69 + 1);
                  iVar103 = 0;
                  do {
                    uVar81 = local_310;
                    memset(local_288,0,local_310);
                    auVar136 = _DAT_00193ce0;
                    auVar125 = _DAT_00193c90;
                    switch((int)uVar81) {
                    case 2:
                      if (iVar69 < 0) {
LAB_00163e6f:
                        uVar93 = 0;
                        uVar81 = 0;
                      }
                      else {
                        uVar93 = 0;
                        uVar81 = 0;
                        do {
                          bVar108 = puVar75[uVar93];
                          bVar119 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar93 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar93 + 2 & 7)) =
                               bVar108;
                          uVar68 = (int)uVar81 + ((uint)bVar108 - (uint)bVar119);
                          uVar81 = (ulong)uVar68;
                          puVar75[uVar93] = (uchar)(uVar68 >> 1);
                          uVar93 = uVar93 + 1;
                        } while (uVar71 != uVar93);
                      }
                      break;
                    case 3:
                      if (iVar69 < 0) goto LAB_00163e6f;
                      uVar93 = 0;
                      uVar81 = 0;
                      do {
                        bVar108 = puVar75[uVar93];
                        bVar119 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar93 & 7));
                        *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar93 + 3 & 7)) =
                             bVar108;
                        uVar81 = (ulong)((int)uVar81 + ((uint)bVar108 - (uint)bVar119));
                        puVar75[uVar93] = (uchar)(uVar81 / 3);
                        uVar93 = uVar93 + 1;
                      } while (uVar71 != uVar93);
                      break;
                    case 4:
                      if (iVar69 < 0) goto LAB_00163e6f;
                      uVar93 = 0;
                      uVar81 = 0;
                      do {
                        bVar108 = puVar75[uVar93];
                        uVar87 = (ulong)((uint)uVar93 & 7);
                        bVar119 = *(byte *)((long)&local_288[0].data + uVar87);
                        *(byte *)((long)&local_288[0].data + (uVar87 ^ 4)) = bVar108;
                        uVar68 = (int)uVar81 + ((uint)bVar108 - (uint)bVar119);
                        uVar81 = (ulong)uVar68;
                        puVar75[uVar93] = (uchar)(uVar68 >> 2);
                        uVar93 = uVar93 + 1;
                      } while (uVar71 != uVar93);
                      break;
                    case 5:
                      if (iVar69 < 0) goto LAB_00163e6f;
                      uVar93 = 0;
                      uVar81 = 0;
                      do {
                        bVar108 = puVar75[uVar93];
                        bVar119 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar93 & 7));
                        *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar93 + 5 & 7)) =
                             bVar108;
                        uVar81 = (ulong)((int)uVar81 + ((uint)bVar108 - (uint)bVar119));
                        puVar75[uVar93] = (uchar)(uVar81 / 5);
                        uVar93 = uVar93 + 1;
                      } while (uVar71 != uVar93);
                      break;
                    default:
                      uVar93 = 0;
                      uVar81 = 0;
                      if (-1 < iVar69) {
                        do {
                          bVar108 = puVar75[uVar93];
                          bVar119 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar93 & 7));
                          *(byte *)((long)&local_288[0].data +
                                   (ulong)((int)local_430 + (uint)uVar93 & 7)) = bVar108;
                          uVar81 = (ulong)((int)uVar81 + ((uint)bVar108 - (uint)bVar119));
                          puVar75[uVar93] = (uchar)(uVar81 / (local_430 & 0xffffffff));
                          uVar93 = uVar93 + 1;
                        } while (uVar71 != uVar93);
                      }
                    }
                    if ((int)uVar93 < (int)(uint)uVar59) {
                      uVar93 = uVar93 & 0xffffffff;
                      do {
                        if (puVar75[uVar93] != '\0') {
                          __assert_fail("pixels[i] == 0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                                        ,0xf41,
                                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar81 = (ulong)((int)uVar81 -
                                        (uint)*(byte *)((long)&local_288[0].data +
                                                       (ulong)((uint)uVar93 & 7)));
                        puVar75[uVar93] = (uchar)(uVar81 / (local_430 & 0xffffffff));
                        uVar93 = uVar93 + 1;
                      } while ((int)uVar93 < (int)(uint)uVar59);
                    }
                    puVar75 = puVar75 + lVar106;
                    iVar103 = iVar103 + 1;
                  } while (iVar103 != auVar115._0_4_);
                }
              }
              if (1 < (byte)local_318) {
                uVar59 = *(ushort *)(local_398 + 4);
                uVar68 = CONCAT22(0,*(ushort *)(local_398 + 6));
                auVar115._0_4_ = uVar68;
                local_288[0].data = (uchar *)0x0;
                if (uVar59 != 0) {
                  pbVar89 = local_3a0 +
                            (ulong)*(ushort *)(local_398 + 10) * lVar106 +
                            (ulong)*(ushort *)(local_398 + 8);
                  iVar103 = uVar68 - (int)local_3c0;
                  uVar71 = (ulong)(iVar103 + 1);
                  uVar68 = 0;
                  do {
                    uVar81 = local_318;
                    memset(local_288,0,local_318);
                    auVar136 = _DAT_00193ce0;
                    auVar125 = _DAT_00193c90;
                    switch((int)uVar81) {
                    case 2:
                      if (iVar103 < 0) {
LAB_0016421f:
                        uVar81 = 0;
                        uVar93 = 0;
                      }
                      else {
                        uVar81 = 0;
                        uVar93 = 0;
                        pbVar94 = pbVar89;
                        do {
                          bVar108 = *pbVar94;
                          bVar119 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar81 & 7));
                          *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar81 + 2 & 7)) =
                               bVar108;
                          uVar102 = (int)uVar93 + ((uint)bVar108 - (uint)bVar119);
                          uVar93 = (ulong)uVar102;
                          *pbVar94 = (byte)(uVar102 >> 1);
                          uVar81 = uVar81 + 1;
                          pbVar94 = pbVar94 + lVar106;
                        } while (uVar71 != uVar81);
                      }
                      break;
                    case 3:
                      if (iVar103 < 0) goto LAB_0016421f;
                      uVar81 = 0;
                      uVar93 = 0;
                      pbVar94 = pbVar89;
                      do {
                        bVar108 = *pbVar94;
                        bVar119 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar81 & 7));
                        *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar81 + 3 & 7)) =
                             bVar108;
                        uVar93 = (ulong)((int)uVar93 + ((uint)bVar108 - (uint)bVar119));
                        *pbVar94 = (byte)(uVar93 / 3);
                        uVar81 = uVar81 + 1;
                        pbVar94 = pbVar94 + lVar106;
                      } while (uVar71 != uVar81);
                      break;
                    case 4:
                      if (iVar103 < 0) goto LAB_0016421f;
                      uVar81 = 0;
                      uVar93 = 0;
                      pbVar94 = pbVar89;
                      do {
                        bVar108 = *pbVar94;
                        uVar87 = (ulong)((uint)uVar81 & 7);
                        bVar119 = *(byte *)((long)&local_288[0].data + uVar87);
                        *(byte *)((long)&local_288[0].data + (uVar87 ^ 4)) = bVar108;
                        uVar102 = (int)uVar93 + ((uint)bVar108 - (uint)bVar119);
                        uVar93 = (ulong)uVar102;
                        *pbVar94 = (byte)(uVar102 >> 2);
                        uVar81 = uVar81 + 1;
                        pbVar94 = pbVar94 + lVar106;
                      } while (uVar71 != uVar81);
                      break;
                    case 5:
                      if (iVar103 < 0) goto LAB_0016421f;
                      uVar81 = 0;
                      uVar93 = 0;
                      pbVar94 = pbVar89;
                      do {
                        bVar108 = *pbVar94;
                        bVar119 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar81 & 7));
                        *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar81 + 5 & 7)) =
                             bVar108;
                        uVar93 = (ulong)((int)uVar93 + ((uint)bVar108 - (uint)bVar119));
                        *pbVar94 = (byte)(uVar93 / 5);
                        uVar81 = uVar81 + 1;
                        pbVar94 = pbVar94 + lVar106;
                      } while (uVar71 != uVar81);
                      break;
                    default:
                      uVar81 = 0;
                      if (iVar103 < 0) {
                        uVar93 = 0;
                      }
                      else {
                        uVar93 = 0;
                        pbVar94 = pbVar89;
                        do {
                          bVar108 = *pbVar94;
                          bVar119 = *(byte *)((long)&local_288[0].data + (ulong)((uint)uVar81 & 7));
                          *(byte *)((long)&local_288[0].data +
                                   (ulong)((uint)local_3c0 + (uint)uVar81 & 7)) = bVar108;
                          uVar93 = (ulong)((int)uVar93 + ((uint)bVar108 - (uint)bVar119));
                          *pbVar94 = (byte)(uVar93 / (local_3c0 & 0xffffffff));
                          uVar81 = uVar81 + 1;
                          pbVar94 = pbVar94 + lVar106;
                        } while (uVar71 != uVar81);
                      }
                    }
                    iVar69 = (int)uVar81;
                    iVar92 = auVar115._0_4_ - iVar69;
                    if (iVar92 != 0 && iVar69 <= auVar115._0_4_) {
                      lVar95 = (long)iVar69;
                      pbVar94 = pbVar89 + lVar106 * lVar95;
                      do {
                        if (*pbVar94 != 0) {
                          __assert_fail("pixels[i*stride_in_bytes] == 0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_truetype.h"
                                        ,0xf7f,
                                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar102 = (int)uVar93 -
                                  (uint)*(byte *)((long)&local_288[0].data +
                                                 (ulong)((uint)lVar95 & 7));
                        uVar93 = (ulong)uVar102;
                        *pbVar94 = (byte)(uVar102 / (uint)local_3c0);
                        lVar95 = lVar95 + 1;
                        pbVar94 = pbVar94 + lVar106;
                        iVar92 = iVar92 + -1;
                      } while (iVar92 != 0);
                    }
                    pbVar89 = pbVar89 + 1;
                    uVar68 = uVar68 + 1;
                  } while (uVar68 != uVar59);
                }
              }
              local_2f0[4] = (float)(int)(short)((short)(local_360 << 8) + (short)local_364) *
                             local_478;
              *(ulong *)(local_2f0 + 2) =
                   CONCAT44((float)local_354 * local_58._4_4_ + (float)local_48._4_4_,
                            (float)local_350 * local_58._0_4_ + (float)local_48._0_4_);
              uVar146 = *(undefined4 *)(local_398 + 8);
              *local_2f0 = uVar146;
              uVar68 = *(uint *)(local_398 + 4);
              uVar59 = (ushort)(uVar68 >> 0x10);
              local_2f0[1] = CONCAT22((short)((uint)uVar146 >> 0x10) + uVar59,
                                      (short)uVar146 + (short)uVar68);
              local_2f0[5] = (float)(int)((uVar68 & 0xffff) + local_350) * local_58._0_4_ +
                             (float)local_48._0_4_;
              local_2f0[6] = (float)(int)((uint)uVar59 + local_354) * local_58._4_4_ +
                             (float)local_48._4_4_;
              lVar95 = local_2f8;
              psVar104 = local_330;
              lVar105 = local_2e8;
              pIVar101 = local_458;
            }
            lVar105 = lVar105 + 1;
          } while (lVar105 < psVar104[1].fontstart);
        }
        fVar98 = local_300[local_3b0].RasterizerMultiply;
        auVar115 = ZEXT416((uint)fVar98);
        if ((fVar98 != 1.0) || (NAN(fVar98))) {
          auVar115._4_4_ = fVar98;
          auVar115._0_4_ = fVar98;
          auVar115._8_4_ = fVar98;
          auVar115._12_4_ = fVar98;
          lVar95 = 0;
          uVar135 = 4;
          uVar139 = 5;
          uVar140 = 6;
          uVar141 = 7;
          uVar142 = 8;
          uVar143 = 9;
          uVar144 = 10;
          uVar145 = 0xb;
          uVar68 = 0xc;
          uVar102 = 0xd;
          uVar70 = 0xe;
          uVar149 = 0xf;
          auVar128 = _DAT_00193c70;
          do {
            auVar158._0_8_ = CONCAT44(uVar139,uVar135) & 0xffff0000ffff;
            auVar158._8_4_ = uVar140 & 0xffff;
            auVar158._12_4_ = uVar141 & 0xffff;
            auVar158 = auVar158 | auVar125;
            uVar133 = auVar128._4_4_;
            uVar134 = auVar128._12_4_;
            auVar169._0_8_ = auVar128._0_8_ & 0xffff0000ffff;
            uVar173 = auVar128._8_4_;
            auVar169._8_4_ = uVar173 & 0xffff;
            auVar169._12_4_ = uVar134 & 0xffff;
            auVar169 = auVar169 | auVar125;
            auVar177._0_8_ = CONCAT44(uVar102,uVar68) & 0xffff0000ffff;
            auVar177._8_4_ = uVar70 & 0xffff;
            auVar177._12_4_ = uVar149 & 0xffff;
            auVar177 = auVar177 | auVar125;
            auVar189._0_8_ = CONCAT44(uVar143,uVar142) & 0xffff0000ffff;
            auVar189._8_4_ = uVar144 & 0xffff;
            auVar189._12_4_ = uVar145 & 0xffff;
            auVar189 = auVar189 | auVar125;
            fVar176 = (((float)(uVar142 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar189._0_4_) *
                      fVar98;
            fVar182 = (((float)(uVar143 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar189._4_4_) *
                      fVar98;
            fVar183 = (((float)(uVar144 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar189._8_4_) *
                      fVar98;
            fVar184 = (((float)(uVar145 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar189._12_4_) *
                      fVar98;
            fVar164 = (((float)(uVar68 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar177._0_4_) *
                      fVar98;
            fVar172 = (((float)(uVar102 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar177._4_4_) *
                      fVar98;
            fVar174 = (((float)(uVar70 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar177._8_4_) *
                      fVar98;
            fVar175 = (((float)(uVar149 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar177._12_4_) *
                      fVar98;
            fVar156 = (((float)(auVar128._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar169._0_4_) * fVar98;
            fVar161 = (((float)(uVar133 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar169._4_4_) *
                      fVar98;
            fVar162 = (((float)(uVar173 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar169._8_4_) *
                      fVar98;
            fVar163 = (((float)(uVar134 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar169._12_4_) *
                      fVar98;
            fVar109 = (((float)(uVar135 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar158._0_4_) *
                      fVar98;
            fVar153 = (((float)(uVar139 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar158._4_4_) *
                      fVar98;
            fVar154 = (((float)(uVar140 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar158._8_4_) *
                      fVar98;
            fVar155 = (((float)(uVar141 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar158._12_4_) *
                      fVar98;
            auVar152._0_4_ = (int)fVar109;
            auVar152._4_4_ = (int)fVar153;
            auVar152._8_4_ = (int)fVar154;
            auVar152._12_4_ = (int)fVar155;
            auVar195._0_4_ = auVar152._0_4_ >> 0x1f;
            auVar195._4_4_ = auVar152._4_4_ >> 0x1f;
            auVar195._8_4_ = auVar152._8_4_ >> 0x1f;
            auVar195._12_4_ = auVar152._12_4_ >> 0x1f;
            auVar151._0_4_ = (int)(fVar109 - 2.1474836e+09);
            auVar151._4_4_ = (int)(fVar153 - 2.1474836e+09);
            auVar151._8_4_ = (int)(fVar154 - 2.1474836e+09);
            auVar151._12_4_ = (int)(fVar155 - 2.1474836e+09);
            auVar152 = auVar151 & auVar195 | auVar152;
            auVar160._0_4_ = (int)fVar156;
            auVar160._4_4_ = (int)fVar161;
            auVar160._8_4_ = (int)fVar162;
            auVar160._12_4_ = (int)fVar163;
            auVar196._0_4_ = auVar160._0_4_ >> 0x1f;
            auVar196._4_4_ = auVar160._4_4_ >> 0x1f;
            auVar196._8_4_ = auVar160._8_4_ >> 0x1f;
            auVar196._12_4_ = auVar160._12_4_ >> 0x1f;
            auVar159._0_4_ = (int)(fVar156 - 2.1474836e+09);
            auVar159._4_4_ = (int)(fVar161 - 2.1474836e+09);
            auVar159._8_4_ = (int)(fVar162 - 2.1474836e+09);
            auVar159._12_4_ = (int)(fVar163 - 2.1474836e+09);
            auVar160 = auVar159 & auVar196 | auVar160;
            auVar191._0_4_ = (int)fVar164;
            auVar191._4_4_ = (int)fVar172;
            auVar191._8_4_ = (int)fVar174;
            auVar191._12_4_ = (int)fVar175;
            auVar199._0_4_ = auVar191._0_4_ >> 0x1f;
            auVar199._4_4_ = auVar191._4_4_ >> 0x1f;
            auVar199._8_4_ = auVar191._8_4_ >> 0x1f;
            auVar199._12_4_ = auVar191._12_4_ >> 0x1f;
            auVar190._0_4_ = (int)(fVar164 - 2.1474836e+09);
            auVar190._4_4_ = (int)(fVar172 - 2.1474836e+09);
            auVar190._8_4_ = (int)(fVar174 - 2.1474836e+09);
            auVar190._12_4_ = (int)(fVar175 - 2.1474836e+09);
            auVar191 = auVar190 & auVar199 | auVar191;
            auVar179._0_4_ = (int)fVar176;
            auVar179._4_4_ = (int)fVar182;
            auVar179._8_4_ = (int)fVar183;
            auVar179._12_4_ = (int)fVar184;
            auVar197._0_4_ = auVar179._0_4_ >> 0x1f;
            auVar197._4_4_ = auVar179._4_4_ >> 0x1f;
            auVar197._8_4_ = auVar179._8_4_ >> 0x1f;
            auVar197._12_4_ = auVar179._12_4_ >> 0x1f;
            auVar178._0_4_ = (int)(fVar176 - 2.1474836e+09);
            auVar178._4_4_ = (int)(fVar182 - 2.1474836e+09);
            auVar178._8_4_ = (int)(fVar183 - 2.1474836e+09);
            auVar178._12_4_ = (int)(fVar184 - 2.1474836e+09);
            auVar179 = auVar178 & auVar197 | auVar179;
            auVar127 = auVar179 ^ _DAT_0018d050;
            auVar170._0_4_ = -(uint)(auVar127._0_4_ < -0x7fffff01);
            auVar170._4_4_ = -(uint)(auVar127._4_4_ < -0x7fffff01);
            auVar170._8_4_ = -(uint)(auVar127._8_4_ < -0x7fffff01);
            auVar170._12_4_ = -(uint)(auVar127._12_4_ < -0x7fffff01);
            auVar127 = ~auVar170 & auVar136 | auVar179 & auVar170;
            auVar180 = auVar191 ^ _DAT_0018d050;
            auVar198._0_4_ = -(uint)(auVar180._0_4_ < -0x7fffff01);
            auVar198._4_4_ = -(uint)(auVar180._4_4_ < -0x7fffff01);
            auVar198._8_4_ = -(uint)(auVar180._8_4_ < -0x7fffff01);
            auVar198._12_4_ = -(uint)(auVar180._12_4_ < -0x7fffff01);
            auVar180 = ~auVar198 & auVar136 | auVar191 & auVar198;
            sVar34 = auVar127._0_2_;
            cVar20 = (0 < sVar34) * (sVar34 < 0x100) * auVar127[0] - (0xff < sVar34);
            sVar34 = auVar127._2_2_;
            sVar60 = CONCAT11((0 < sVar34) * (sVar34 < 0x100) * auVar127[2] - (0xff < sVar34),cVar20
                             );
            sVar34 = auVar127._4_2_;
            cVar120 = (0 < sVar34) * (sVar34 < 0x100) * auVar127[4] - (0xff < sVar34);
            sVar34 = auVar127._6_2_;
            uVar146 = CONCAT13((0 < sVar34) * (sVar34 < 0x100) * auVar127[6] - (0xff < sVar34),
                               CONCAT12(cVar120,sVar60));
            sVar34 = auVar127._8_2_;
            cVar21 = (0 < sVar34) * (sVar34 < 0x100) * auVar127[8] - (0xff < sVar34);
            sVar34 = auVar127._10_2_;
            uVar165 = CONCAT15((0 < sVar34) * (sVar34 < 0x100) * auVar127[10] - (0xff < sVar34),
                               CONCAT14(cVar21,uVar146));
            sVar34 = auVar127._12_2_;
            cVar22 = (0 < sVar34) * (sVar34 < 0x100) * auVar127[0xc] - (0xff < sVar34);
            sVar34 = auVar127._14_2_;
            uVar166 = CONCAT17((0 < sVar34) * (sVar34 < 0x100) * auVar127[0xe] - (0xff < sVar34),
                               CONCAT16(cVar22,uVar165));
            sVar34 = auVar180._0_2_;
            cVar23 = (0 < sVar34) * (sVar34 < 0x100) * auVar180[0] - (0xff < sVar34);
            sVar34 = auVar180._2_2_;
            auVar167._0_10_ =
                 CONCAT19((0 < sVar34) * (sVar34 < 0x100) * auVar180[2] - (0xff < sVar34),
                          CONCAT18(cVar23,uVar166));
            sVar34 = auVar180._4_2_;
            cVar24 = (0 < sVar34) * (sVar34 < 0x100) * auVar180[4] - (0xff < sVar34);
            auVar167[10] = cVar24;
            sVar34 = auVar180._6_2_;
            auVar167[0xb] = (0 < sVar34) * (sVar34 < 0x100) * auVar180[6] - (0xff < sVar34);
            sVar34 = auVar180._8_2_;
            cVar25 = (0 < sVar34) * (sVar34 < 0x100) * auVar180[8] - (0xff < sVar34);
            auVar168[0xc] = cVar25;
            auVar168._0_12_ = auVar167;
            sVar34 = auVar180._10_2_;
            auVar168[0xd] = (0 < sVar34) * (sVar34 < 0x100) * auVar180[10] - (0xff < sVar34);
            sVar34 = auVar180._12_2_;
            cVar121 = (0 < sVar34) * (sVar34 < 0x100) * auVar180[0xc] - (0xff < sVar34);
            auVar171[0xe] = cVar121;
            auVar171._0_14_ = auVar168;
            sVar34 = auVar180._14_2_;
            auVar171[0xf] = (0 < sVar34) * (sVar34 < 0x100) * auVar180[0xe] - (0xff < sVar34);
            auVar127 = auVar160 ^ _DAT_0018d050;
            auVar192._0_4_ = -(uint)(auVar127._0_4_ < -0x7fffff01);
            auVar192._4_4_ = -(uint)(auVar127._4_4_ < -0x7fffff01);
            auVar192._8_4_ = -(uint)(auVar127._8_4_ < -0x7fffff01);
            auVar192._12_4_ = -(uint)(auVar127._12_4_ < -0x7fffff01);
            auVar180 = ~auVar192 & auVar136 | auVar160 & auVar192;
            auVar127 = auVar152 ^ _DAT_0018d050;
            auVar181._0_4_ = -(uint)(auVar127._0_4_ < -0x7fffff01);
            auVar181._4_4_ = -(uint)(auVar127._4_4_ < -0x7fffff01);
            auVar181._8_4_ = -(uint)(auVar127._8_4_ < -0x7fffff01);
            auVar181._12_4_ = -(uint)(auVar127._12_4_ < -0x7fffff01);
            auVar127 = ~auVar181 & auVar136 | auVar152 & auVar181;
            sVar34 = auVar180._0_2_;
            cVar26 = (0 < sVar34) * (sVar34 < 0x100) * auVar180[0] - (0xff < sVar34);
            sVar34 = auVar180._2_2_;
            sVar122 = CONCAT11((0 < sVar34) * (sVar34 < 0x100) * auVar180[2] - (0xff < sVar34),
                               cVar26);
            sVar34 = auVar180._4_2_;
            cVar27 = (0 < sVar34) * (sVar34 < 0x100) * auVar180[4] - (0xff < sVar34);
            sVar34 = auVar180._6_2_;
            uVar147 = CONCAT13((0 < sVar34) * (sVar34 < 0x100) * auVar180[6] - (0xff < sVar34),
                               CONCAT12(cVar27,sVar122));
            sVar34 = auVar180._8_2_;
            cVar28 = (0 < sVar34) * (sVar34 < 0x100) * auVar180[8] - (0xff < sVar34);
            sVar34 = auVar180._10_2_;
            uVar185 = CONCAT15((0 < sVar34) * (sVar34 < 0x100) * auVar180[10] - (0xff < sVar34),
                               CONCAT14(cVar28,uVar147));
            sVar34 = auVar180._12_2_;
            cVar29 = (0 < sVar34) * (sVar34 < 0x100) * auVar180[0xc] - (0xff < sVar34);
            sVar34 = auVar180._14_2_;
            uVar186 = CONCAT17((0 < sVar34) * (sVar34 < 0x100) * auVar180[0xe] - (0xff < sVar34),
                               CONCAT16(cVar29,uVar185));
            sVar34 = auVar127._0_2_;
            cVar30 = (0 < sVar34) * (sVar34 < 0x100) * auVar127[0] - (0xff < sVar34);
            sVar34 = auVar127._2_2_;
            auVar187._0_10_ =
                 CONCAT19((0 < sVar34) * (sVar34 < 0x100) * auVar127[2] - (0xff < sVar34),
                          CONCAT18(cVar30,uVar186));
            sVar34 = auVar127._4_2_;
            cVar31 = (0 < sVar34) * (sVar34 < 0x100) * auVar127[4] - (0xff < sVar34);
            auVar187[10] = cVar31;
            sVar34 = auVar127._6_2_;
            auVar187[0xb] = (0 < sVar34) * (sVar34 < 0x100) * auVar127[6] - (0xff < sVar34);
            sVar34 = auVar127._8_2_;
            cVar32 = (0 < sVar34) * (sVar34 < 0x100) * auVar127[8] - (0xff < sVar34);
            auVar188[0xc] = cVar32;
            auVar188._0_12_ = auVar187;
            sVar34 = auVar127._10_2_;
            auVar188[0xd] = (0 < sVar34) * (sVar34 < 0x100) * auVar127[10] - (0xff < sVar34);
            sVar34 = auVar127._12_2_;
            cVar33 = (0 < sVar34) * (sVar34 < 0x100) * auVar127[0xc] - (0xff < sVar34);
            auVar193[0xe] = cVar33;
            auVar193._0_14_ = auVar188;
            sVar34 = auVar127._14_2_;
            auVar193[0xf] = (0 < sVar34) * (sVar34 < 0x100) * auVar127[0xe] - (0xff < sVar34);
            sVar34 = (short)((uint)uVar147 >> 0x10);
            auVar194[1] = (0 < sVar34) * (sVar34 < 0x100) * cVar27 - (0xff < sVar34);
            auVar194[0] = (0 < sVar122) * (sVar122 < 0x100) * cVar26 - (0xff < sVar122);
            sVar34 = (short)((uint6)uVar185 >> 0x20);
            auVar194[2] = (0 < sVar34) * (sVar34 < 0x100) * cVar28 - (0xff < sVar34);
            sVar34 = (short)((ulong)uVar186 >> 0x30);
            auVar194[3] = (0 < sVar34) * (sVar34 < 0x100) * cVar29 - (0xff < sVar34);
            sVar34 = (short)((unkuint10)auVar187._0_10_ >> 0x40);
            auVar194[4] = (0 < sVar34) * (sVar34 < 0x100) * cVar30 - (0xff < sVar34);
            sVar34 = auVar187._10_2_;
            auVar194[5] = (0 < sVar34) * (sVar34 < 0x100) * cVar31 - (0xff < sVar34);
            sVar34 = auVar188._12_2_;
            auVar194[6] = (0 < sVar34) * (sVar34 < 0x100) * cVar32 - (0xff < sVar34);
            sVar34 = auVar193._14_2_;
            auVar194[7] = (0 < sVar34) * (sVar34 < 0x100) * cVar33 - (0xff < sVar34);
            auVar194[8] = (0 < sVar60) * (sVar60 < 0x100) * cVar20 - (0xff < sVar60);
            sVar34 = (short)((uint)uVar146 >> 0x10);
            auVar194[9] = (0 < sVar34) * (sVar34 < 0x100) * cVar120 - (0xff < sVar34);
            sVar34 = (short)((uint6)uVar165 >> 0x20);
            auVar194[10] = (0 < sVar34) * (sVar34 < 0x100) * cVar21 - (0xff < sVar34);
            sVar34 = (short)((ulong)uVar166 >> 0x30);
            auVar194[0xb] = (0 < sVar34) * (sVar34 < 0x100) * cVar22 - (0xff < sVar34);
            sVar34 = (short)((unkuint10)auVar167._0_10_ >> 0x40);
            auVar194[0xc] = (0 < sVar34) * (sVar34 < 0x100) * cVar23 - (0xff < sVar34);
            sVar34 = auVar167._10_2_;
            auVar194[0xd] = (0 < sVar34) * (sVar34 < 0x100) * cVar24 - (0xff < sVar34);
            sVar34 = auVar168._12_2_;
            auVar194[0xe] = (0 < sVar34) * (sVar34 < 0x100) * cVar25 - (0xff < sVar34);
            sVar34 = auVar171._14_2_;
            auVar194[0xf] = (0 < sVar34) * (sVar34 < 0x100) * cVar121 - (0xff < sVar34);
            *(undefined1 (*) [16])((long)&local_288[0].data + lVar95) = auVar194;
            lVar95 = lVar95 + 0x10;
            iVar103 = (int)DAT_00193cf0;
            auVar128._0_4_ = auVar128._0_4_ + iVar103;
            iVar69 = DAT_00193cf0._4_4_;
            auVar128._4_4_ = uVar133 + iVar69;
            iVar92 = DAT_00193cf0._8_4_;
            auVar128._8_4_ = uVar173 + iVar92;
            iVar79 = DAT_00193cf0._12_4_;
            auVar128._12_4_ = uVar134 + iVar79;
            uVar135 = uVar135 + iVar103;
            uVar139 = uVar139 + iVar69;
            uVar140 = uVar140 + iVar92;
            uVar141 = uVar141 + iVar79;
            uVar142 = uVar142 + iVar103;
            uVar143 = uVar143 + iVar69;
            uVar144 = uVar144 + iVar92;
            uVar145 = uVar145 + iVar79;
            uVar68 = uVar68 + iVar103;
            uVar102 = uVar102 + iVar69;
            uVar70 = uVar70 + iVar92;
            uVar149 = uVar149 + iVar79;
          } while (lVar95 != 0x100);
          if (0 < psVar104[1].cff.cursor) {
            lVar105._0_4_ = psVar104[1].hmtx;
            lVar105._4_4_ = psVar104[1].kern;
            iVar103 = 0;
            do {
              if ((*(int *)(lVar105 + 0xc) != 0) && (*(ushort *)(lVar105 + 6) != 0)) {
                uVar59 = *(ushort *)(lVar105 + 4);
                iVar69 = pIVar101->TexWidth;
                puVar75 = pIVar101->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar105 + 10) * (long)iVar69 +
                          (ulong)*(ushort *)(lVar105 + 8);
                uVar68 = (uint)*(ushort *)(lVar105 + 6);
                do {
                  if ((ulong)uVar59 != 0) {
                    uVar71 = 0;
                    do {
                      puVar75[uVar71] =
                           *(uchar *)((long)&local_288[0].data + (ulong)puVar75[uVar71]);
                      uVar71 = uVar71 + 1;
                    } while (uVar59 != uVar71);
                  }
                  puVar75 = puVar75 + iVar69;
                  bVar58 = 1 < (int)uVar68;
                  uVar68 = uVar68 - 1;
                } while (bVar58);
              }
              iVar103 = iVar103 + 1;
              lVar105 = lVar105 + 0x10;
            } while (iVar103 < psVar104[1].cff.cursor);
          }
        }
        psVar104[1].hmtx = 0;
        psVar104[1].kern = 0;
      }
      lVar95 = local_3b0 + 1;
    } while (lVar95 != lVar80);
  }
  ImGui::MemFree(local_408);
  ImGui::MemFree(local_338);
  uVar166 = local_468._8_8_;
  if ((void *)local_468._8_8_ != (void *)0x0) {
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_468._8_8_;
    local_468 = auVar42 << 0x40;
    ImGui::MemFree((void *)uVar166);
    local_468._8_8_ = 0;
  }
  if (0 < (int)uVar14) {
    lVar106 = 0;
    auVar118._0_12_ = DAT_00193c30._0_12_;
    auVar118._12_2_ = DAT_00193c30._6_2_;
    auVar118._14_2_ = DAT_00193c30._6_2_;
    auVar117._12_4_ = auVar118._12_4_;
    auVar117._0_10_ = (unkbyte10)DAT_00193c30;
    auVar117._10_2_ = DAT_00193c30._4_2_;
    auVar116._10_6_ = auVar117._10_6_;
    auVar116._0_8_ = (undefined8)DAT_00193c30;
    auVar116._8_2_ = DAT_00193c30._4_2_;
    local_488._8_8_ = auVar116._8_8_;
    local_488._6_2_ = DAT_00193c30._2_2_;
    local_488._4_2_ = DAT_00193c30._2_2_;
    local_488._0_2_ = (undefined2)DAT_00193c30;
    local_488._2_2_ = local_488._0_2_;
    do {
      auVar125 = local_448;
      lVar95 = lVar106 * 0x110;
      if (*(int *)((long)local_4d0 + lVar95 + 0xe8) != 0) {
        if ((local_458->ConfigData).Size <= lVar106) goto LAB_00164cbf;
        pIVar18 = (local_458->ConfigData).Data;
        pIVar96 = pIVar18 + lVar106;
        pIVar15 = pIVar18[lVar106].DstFont;
        if (pIVar18[lVar106].MergeMode == false) {
          auVar115 = ZEXT416((uint)pIVar18[lVar106].SizePixels);
          lVar105 = *(long *)((long)local_4d0 + lVar95 + 8);
          lVar86 = (long)*(int *)((long)local_4d0 + lVar95 + 0x24);
          local_448._1_3_ = 0;
          local_448[0] = *(byte *)(lVar105 + 4 + lVar86);
          local_448._4_12_ = auVar125._4_12_;
          bVar108 = *(byte *)(lVar105 + 5 + lVar86);
          bVar119 = *(byte *)(lVar105 + 7 + lVar86);
          bVar12 = *(byte *)(lVar105 + 6 + lVar86);
          ImFont::ClearOutputData(pIVar15);
          iVar103 = (uint)bVar12 * 0x100 + local_448._0_4_;
          auVar36._1_9_ = (unkuint9)(byte)((uint)iVar103 >> 0x18) << 8;
          auVar36[0] = (char)((uint)iVar103 >> 0x10);
          auVar36._10_6_ = 0;
          auVar47._1_12_ = SUB1612(auVar36 << 0x28,4);
          auVar47[0] = (char)((uint)iVar103 >> 8);
          auVar47[0xd] = 0;
          auVar50._1_14_ = auVar47 << 8;
          auVar50[0] = (char)iVar103;
          auVar50[0xf] = 0;
          auVar125 = ZEXT416((uint)bVar108 | (uint)bVar119 << 0x10) | auVar50 << 8;
          sVar60 = auVar125._0_2_;
          sVar34 = auVar125._2_2_;
          auVar129._0_4_ = (float)((int)sVar60 - (int)sVar34);
          fVar98 = auVar115._0_4_ / auVar129._0_4_;
          sVar124 = auVar125._6_2_;
          auVar132._0_14_ = ZEXT414((uint)auVar129._0_4_);
          auVar132._14_2_ = sVar124;
          sVar122 = auVar125._4_2_;
          auVar131._12_4_ = auVar132._12_4_;
          auVar131._4_6_ = 0;
          auVar131._0_4_ = auVar129._0_4_;
          auVar131._10_2_ = sVar122;
          auVar130._10_6_ = auVar131._10_6_;
          auVar130._4_6_ = 0;
          auVar130._0_4_ = auVar129._0_4_;
          auVar129._8_8_ = auVar130._8_8_;
          auVar129._6_2_ = sVar34;
          auVar129._4_2_ = (short)((uint)auVar129._0_4_ >> 0x10);
          auVar138._0_2_ = -(ushort)(sVar60 < (short)local_488._0_2_);
          auVar138._2_2_ = -(ushort)(sVar60 < (short)local_488._2_2_);
          auVar138._4_2_ = -(ushort)(sVar34 < (short)local_488._4_2_);
          auVar138._6_2_ = -(ushort)(sVar34 < (short)local_488._6_2_);
          auVar138._8_2_ = -(ushort)(sVar122 < (short)local_488._8_2_);
          auVar138._10_2_ = -(ushort)(sVar122 < (short)local_488._10_2_);
          auVar138._12_2_ = -(ushort)(sVar124 < (short)local_488._12_2_);
          auVar138._14_2_ = -(ushort)(sVar124 < (short)local_488._14_2_);
          auVar125 = auVar138 & _DAT_0018e750 | ~auVar138 & _DAT_0018d0e0;
          pIVar15->FontSize = pIVar96->SizePixels;
          pIVar15->ConfigData = pIVar96;
          pIVar15->ContainerAtlas = local_458;
          pIVar15->Ascent = (float)(int)(fVar98 * (float)(int)sVar60 + auVar125._0_4_);
          pIVar15->Descent = (float)(int)(fVar98 * (float)(auVar129._4_4_ >> 0x10) + auVar125._4_4_)
          ;
        }
        pIVar15->ConfigDataCount = pIVar15->ConfigDataCount + 1;
        if (0 < *(int *)((long)local_4d0 + lVar95 + 0xe8)) {
          auVar115._0_4_ = (pIVar96->GlyphOffset).x;
          local_448 = ZEXT416((uint)((float)(int)(pIVar15->Ascent + 0.5) + (pIVar96->GlyphOffset).y)
                             );
          lVar86 = 0;
          lVar105 = 0;
          do {
            if (*(int *)((long)local_4d0 + lVar95 + 0x100) <= lVar105) goto LAB_00164c43;
            lVar19 = *(long *)((long)local_4d0 + lVar95 + 0xd0);
            fVar98 = *(float *)(lVar19 + 0x10 + lVar86);
            fVar109 = pIVar96->GlyphMaxAdvanceX;
            if (fVar98 <= pIVar96->GlyphMaxAdvanceX) {
              fVar109 = fVar98;
            }
            uVar68 = -(uint)(fVar98 < pIVar96->GlyphMinAdvanceX);
            fVar109 = (float)(uVar68 & (uint)pIVar96->GlyphMinAdvanceX | ~uVar68 & (uint)fVar109);
            fVar153 = auVar115._0_4_;
            if ((fVar98 != fVar109) || (NAN(fVar98) || NAN(fVar109))) {
              fVar98 = (fVar109 - fVar98) * 0.5;
              if (pIVar96->PixelSnapH != false) {
                fVar98 = (float)(int)fVar98;
              }
              fVar153 = fVar98 + fVar153;
            }
            fVar154 = 1.0 / (float)local_458->TexHeight;
            fVar98 = 1.0 / (float)local_458->TexWidth;
            ImFont::AddGlyph(pIVar15,(ImWchar)*(undefined4 *)
                                               (*(long *)((long)local_4d0 + lVar95 + 0x108) +
                                               lVar105 * 4),
                             *(float *)(lVar19 + 8 + lVar86) + 0.0 + fVar153,
                             *(float *)(lVar19 + 0xc + lVar86) + 0.0 + (float)local_448._0_4_,
                             *(float *)(lVar19 + 0x14 + lVar86) + 0.0 + fVar153,
                             *(float *)(lVar19 + 0x18 + lVar86) + 0.0 + (float)local_448._0_4_,
                             (float)*(ushort *)(lVar19 + lVar86) * fVar98,
                             (float)*(ushort *)(lVar19 + 2 + lVar86) * fVar154,
                             (float)*(ushort *)(lVar19 + 4 + lVar86) * fVar98,
                             (float)*(ushort *)(lVar19 + 6 + lVar86) * fVar154,fVar109);
            lVar105 = lVar105 + 1;
            lVar86 = lVar86 + 0x1c;
          } while (lVar105 < *(int *)((long)local_4d0 + lVar95 + 0xe8));
        }
      }
      lVar106 = lVar106 + 1;
    } while (lVar106 != lVar80);
  }
  sVar57 = local_308;
  pIVar101 = local_458;
  if (0 < (int)uVar14) {
    sVar88 = 0;
    do {
      pvVar74 = *(void **)((long)local_4d0 + sVar88 + 0x108);
      if (pvVar74 != (void *)0x0) {
        ImGui::MemFree(pvVar74);
      }
      pvVar74 = *(void **)((long)local_4d0 + sVar88 + 0xf8);
      if (pvVar74 != (void *)0x0) {
        ImGui::MemFree(pvVar74);
      }
      sVar88 = sVar88 + 0x110;
    } while (sVar57 != sVar88);
  }
  ImFontAtlasBuildFinish(pIVar101);
  if (pvStack_410 != (void *)0x0) {
    ImGui::MemFree(pvStack_410);
  }
  if ((void *)local_468._8_8_ != (void *)0x0) {
    ImGui::MemFree((void *)local_468._8_8_);
  }
LAB_00164b31:
  bVar108 = (byte)((uint)iVar201 >> 0x18);
  if (local_420 != (void *)0x0) {
    ImGui::MemFree(local_420);
  }
  if (local_4d0 != (void *)0x0) {
    ImGui::MemFree(local_4d0);
  }
  return (bool)(bVar108 & 1);
LAB_00164cd6:
  __function = "T &ImVector<ImFontBuildDstData>::operator[](int) [T = ImFontBuildDstData]";
  goto LAB_00164c58;
LAB_00164cbf:
  __function = "T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]";
  goto LAB_00164c58;
LAB_00164c43:
  __function = "T &ImVector<int>::operator[](int) [T = int]";
LAB_00164c58:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                ,0x52e,__function);
}

Assistant:

bool    ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
        if (src_tmp.DstIndex == -1)
            return false;

        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096*0.7f) ? 4096 : (surface_sqrt >= 2048*0.7f) ? 2048 : (surface_sqrt >= 1024*0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont; // We can have multiple input fonts writing into a same destination font (when using MergeMode=true)

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];

            const float char_advance_x_org = pc.xadvance;
            const float char_advance_x_mod = ImClamp(char_advance_x_org, cfg.GlyphMinAdvanceX, cfg.GlyphMaxAdvanceX);
            float char_off_x = font_off_x;
            if (char_advance_x_org != char_advance_x_mod)
                char_off_x += cfg.PixelSnapH ? ImFloor((char_advance_x_mod - char_advance_x_org) * 0.5f) : (char_advance_x_mod - char_advance_x_org) * 0.5f;

            // Register glyph
            stbtt_aligned_quad q;
            float dummy_x = 0.0f, dummy_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &dummy_x, &dummy_y, &q, 0);
            dst_font->AddGlyph((ImWchar)codepoint, q.x0 + char_off_x, q.y0 + font_off_y, q.x1 + char_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, char_advance_x_mod);
        }
    }

    // Cleanup temporary (ImVector doesn't honor destructor)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
        src_tmp_array[src_i].~ImFontBuildSrcData();

    ImFontAtlasBuildFinish(atlas);
    return true;
}